

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [28];
  undefined1 auVar30 [28];
  undefined1 auVar31 [28];
  undefined1 auVar32 [28];
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  byte bVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar44;
  long lVar45;
  ulong uVar46;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar47;
  ulong uVar48;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar65 [16];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  int iVar120;
  float t1;
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar124;
  float fVar125;
  undefined4 uVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vfloat4 b0;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  vfloat4 b0_1;
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar173 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  vfloat4 a0_2;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar210;
  float fVar221;
  float fVar222;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar223;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar224;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar231;
  float fVar240;
  float fVar241;
  vfloat4 a0_1;
  float fVar242;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  float fVar249;
  float fVar250;
  vfloat4 a0;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  float fVar251;
  undefined1 auVar248 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  int iVar266;
  undefined1 in_ZMM30 [64];
  undefined1 auVar267 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar268 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_470;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  uint auStack_3f0 [4];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  uint uStack_280;
  float afStack_27c [7];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar43;
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  uint uVar119;
  
  PVar3 = prim[1];
  uVar46 = (ulong)(byte)PVar3;
  fVar144 = *(float *)(prim + uVar46 * 0x19 + 0x12);
  auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar60 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar122 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar50 = vsubps_avx(auVar49,*(undefined1 (*) [16])(prim + uVar46 * 0x19 + 6));
  fVar143 = fVar144 * auVar50._0_4_;
  fVar121 = fVar144 * auVar122._0_4_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar46 * 4 + 6);
  auVar82 = vpmovsxbd_avx2(auVar49);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar46 * 5 + 6);
  auVar80 = vpmovsxbd_avx2(auVar60);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar46 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar59);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar46 * 0xb + 6);
  auVar97 = vpmovsxbd_avx2(auVar58);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar90 = vpmovsxbd_avx2(auVar57);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vcvtdq2ps_avx(auVar90);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar46 + 6);
  auVar81 = vpmovsxbd_avx2(auVar56);
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar48 = (ulong)(uint)((int)(uVar46 * 9) * 2);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar48 + 6);
  auVar87 = vpmovsxbd_avx2(auVar55);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar48 + uVar46 + 6);
  auVar88 = vpmovsxbd_avx2(auVar54);
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar42 = (ulong)(uint)((int)(uVar46 * 5) << 2);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar42 + 6);
  auVar79 = vpmovsxbd_avx2(auVar53);
  auVar89 = vcvtdq2ps_avx(auVar79);
  auVar159._4_4_ = fVar121;
  auVar159._0_4_ = fVar121;
  auVar159._8_4_ = fVar121;
  auVar159._12_4_ = fVar121;
  auVar159._16_4_ = fVar121;
  auVar159._20_4_ = fVar121;
  auVar159._24_4_ = fVar121;
  auVar159._28_4_ = fVar121;
  auVar258._8_4_ = 1;
  auVar258._0_8_ = 0x100000001;
  auVar258._12_4_ = 1;
  auVar258._16_4_ = 1;
  auVar258._20_4_ = 1;
  auVar258._24_4_ = 1;
  auVar258._28_4_ = 1;
  auVar77 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar92 = ZEXT1632(CONCAT412(fVar144 * auVar122._12_4_,
                               CONCAT48(fVar144 * auVar122._8_4_,
                                        CONCAT44(fVar144 * auVar122._4_4_,fVar121))));
  auVar91 = vpermps_avx2(auVar258,auVar92);
  auVar78 = vpermps_avx512vl(auVar77,auVar92);
  fVar121 = auVar78._0_4_;
  fVar210 = auVar78._4_4_;
  auVar92._4_4_ = fVar210 * auVar96._4_4_;
  auVar92._0_4_ = fVar121 * auVar96._0_4_;
  fVar221 = auVar78._8_4_;
  auVar92._8_4_ = fVar221 * auVar96._8_4_;
  fVar222 = auVar78._12_4_;
  auVar92._12_4_ = fVar222 * auVar96._12_4_;
  fVar124 = auVar78._16_4_;
  auVar92._16_4_ = fVar124 * auVar96._16_4_;
  fVar125 = auVar78._20_4_;
  auVar92._20_4_ = fVar125 * auVar96._20_4_;
  fVar223 = auVar78._24_4_;
  auVar92._24_4_ = fVar223 * auVar96._24_4_;
  auVar92._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar81._4_4_ * fVar210;
  auVar90._0_4_ = auVar81._0_4_ * fVar121;
  auVar90._8_4_ = auVar81._8_4_ * fVar221;
  auVar90._12_4_ = auVar81._12_4_ * fVar222;
  auVar90._16_4_ = auVar81._16_4_ * fVar124;
  auVar90._20_4_ = auVar81._20_4_ * fVar125;
  auVar90._24_4_ = auVar81._24_4_ * fVar223;
  auVar90._28_4_ = auVar79._28_4_;
  auVar79._4_4_ = auVar89._4_4_ * fVar210;
  auVar79._0_4_ = auVar89._0_4_ * fVar121;
  auVar79._8_4_ = auVar89._8_4_ * fVar221;
  auVar79._12_4_ = auVar89._12_4_ * fVar222;
  auVar79._16_4_ = auVar89._16_4_ * fVar124;
  auVar79._20_4_ = auVar89._20_4_ * fVar125;
  auVar79._24_4_ = auVar89._24_4_ * fVar223;
  auVar79._28_4_ = auVar78._28_4_;
  auVar49 = vfmadd231ps_fma(auVar92,auVar91,auVar80);
  auVar60 = vfmadd231ps_fma(auVar90,auVar91,auVar98);
  auVar59 = vfmadd231ps_fma(auVar79,auVar88,auVar91);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar159,auVar82);
  auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar159,auVar97);
  auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar87,auVar159);
  auVar247._4_4_ = fVar143;
  auVar247._0_4_ = fVar143;
  auVar247._8_4_ = fVar143;
  auVar247._12_4_ = fVar143;
  auVar247._16_4_ = fVar143;
  auVar247._20_4_ = fVar143;
  auVar247._24_4_ = fVar143;
  auVar247._28_4_ = fVar143;
  auVar79 = ZEXT1632(CONCAT412(fVar144 * auVar50._12_4_,
                               CONCAT48(fVar144 * auVar50._8_4_,
                                        CONCAT44(fVar144 * auVar50._4_4_,fVar143))));
  auVar90 = vpermps_avx2(auVar258,auVar79);
  auVar79 = vpermps_avx512vl(auVar77,auVar79);
  fVar144 = auVar79._0_4_;
  fVar121 = auVar79._4_4_;
  auVar91._4_4_ = fVar121 * auVar96._4_4_;
  auVar91._0_4_ = fVar144 * auVar96._0_4_;
  fVar210 = auVar79._8_4_;
  auVar91._8_4_ = fVar210 * auVar96._8_4_;
  fVar221 = auVar79._12_4_;
  auVar91._12_4_ = fVar221 * auVar96._12_4_;
  fVar222 = auVar79._16_4_;
  auVar91._16_4_ = fVar222 * auVar96._16_4_;
  fVar124 = auVar79._20_4_;
  auVar91._20_4_ = fVar124 * auVar96._20_4_;
  fVar125 = auVar79._24_4_;
  auVar91._24_4_ = fVar125 * auVar96._24_4_;
  auVar91._28_4_ = 1;
  auVar77._4_4_ = auVar81._4_4_ * fVar121;
  auVar77._0_4_ = auVar81._0_4_ * fVar144;
  auVar77._8_4_ = auVar81._8_4_ * fVar210;
  auVar77._12_4_ = auVar81._12_4_ * fVar221;
  auVar77._16_4_ = auVar81._16_4_ * fVar222;
  auVar77._20_4_ = auVar81._20_4_ * fVar124;
  auVar77._24_4_ = auVar81._24_4_ * fVar125;
  auVar77._28_4_ = auVar96._28_4_;
  auVar81._4_4_ = auVar89._4_4_ * fVar121;
  auVar81._0_4_ = auVar89._0_4_ * fVar144;
  auVar81._8_4_ = auVar89._8_4_ * fVar210;
  auVar81._12_4_ = auVar89._12_4_ * fVar221;
  auVar81._16_4_ = auVar89._16_4_ * fVar222;
  auVar81._20_4_ = auVar89._20_4_ * fVar124;
  auVar81._24_4_ = auVar89._24_4_ * fVar125;
  auVar81._28_4_ = auVar79._28_4_;
  auVar58 = vfmadd231ps_fma(auVar91,auVar90,auVar80);
  auVar57 = vfmadd231ps_fma(auVar77,auVar90,auVar98);
  auVar56 = vfmadd231ps_fma(auVar81,auVar90,auVar88);
  auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar247,auVar82);
  auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar247,auVar97);
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar247,auVar87);
  auVar82 = vandps_avx(ZEXT1632(auVar49),auVar100);
  auVar152._8_4_ = 0x219392ef;
  auVar152._0_8_ = 0x219392ef219392ef;
  auVar152._12_4_ = 0x219392ef;
  auVar152._16_4_ = 0x219392ef;
  auVar152._20_4_ = 0x219392ef;
  auVar152._24_4_ = 0x219392ef;
  auVar152._28_4_ = 0x219392ef;
  uVar48 = vcmpps_avx512vl(auVar82,auVar152,1);
  bVar10 = (bool)((byte)uVar48 & 1);
  auVar78._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._0_4_;
  bVar10 = (bool)((byte)(uVar48 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._4_4_;
  bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._8_4_;
  bVar10 = (bool)((byte)(uVar48 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._12_4_;
  auVar78._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * 0x219392ef;
  auVar78._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * 0x219392ef;
  auVar78._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * 0x219392ef;
  auVar78._28_4_ = (uint)(byte)(uVar48 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar60),auVar100);
  uVar48 = vcmpps_avx512vl(auVar82,auVar152,1);
  bVar10 = (bool)((byte)uVar48 & 1);
  auVar93._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar60._0_4_;
  bVar10 = (bool)((byte)(uVar48 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar60._4_4_;
  bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar60._8_4_;
  bVar10 = (bool)((byte)(uVar48 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar60._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar48 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar59),auVar100);
  uVar48 = vcmpps_avx512vl(auVar82,auVar152,1);
  bVar10 = (bool)((byte)uVar48 & 1);
  auVar82._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar59._0_4_;
  bVar10 = (bool)((byte)(uVar48 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar59._4_4_;
  bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar59._8_4_;
  bVar10 = (bool)((byte)(uVar48 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar59._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar48 >> 7) * 0x219392ef;
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = &DAT_3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar49 = vfnmadd213ps_fma(auVar78,auVar80,auVar101);
  auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar93);
  auVar60 = vfnmadd213ps_fma(auVar93,auVar80,auVar101);
  auVar60 = vfmadd132ps_fma(ZEXT1632(auVar60),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar82);
  auVar59 = vfnmadd213ps_fma(auVar82,auVar80,auVar101);
  auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar80,auVar80);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar46 * 7 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar58));
  auVar87._4_4_ = auVar49._4_4_ * auVar82._4_4_;
  auVar87._0_4_ = auVar49._0_4_ * auVar82._0_4_;
  auVar87._8_4_ = auVar49._8_4_ * auVar82._8_4_;
  auVar87._12_4_ = auVar49._12_4_ * auVar82._12_4_;
  auVar87._16_4_ = auVar82._16_4_ * 0.0;
  auVar87._20_4_ = auVar82._20_4_ * 0.0;
  auVar87._24_4_ = auVar82._24_4_ * 0.0;
  auVar87._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar46 * 9 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar58));
  auVar81 = vpbroadcastd_avx512vl();
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar99._0_4_ = auVar49._0_4_ * auVar82._0_4_;
  auVar99._4_4_ = auVar49._4_4_ * auVar82._4_4_;
  auVar99._8_4_ = auVar49._8_4_ * auVar82._8_4_;
  auVar99._12_4_ = auVar49._12_4_ * auVar82._12_4_;
  auVar99._16_4_ = auVar82._16_4_ * 0.0;
  auVar99._20_4_ = auVar82._20_4_ * 0.0;
  auVar99._24_4_ = auVar82._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar3 * 0x10 + uVar46 * -2 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar57));
  auVar88._4_4_ = auVar60._4_4_ * auVar82._4_4_;
  auVar88._0_4_ = auVar60._0_4_ * auVar82._0_4_;
  auVar88._8_4_ = auVar60._8_4_ * auVar82._8_4_;
  auVar88._12_4_ = auVar60._12_4_ * auVar82._12_4_;
  auVar88._16_4_ = auVar82._16_4_ * 0.0;
  auVar88._20_4_ = auVar82._20_4_ * 0.0;
  auVar88._24_4_ = auVar82._24_4_ * 0.0;
  auVar88._28_4_ = auVar82._28_4_;
  auVar82 = vcvtdq2ps_avx(auVar80);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar57));
  auVar95._0_4_ = auVar60._0_4_ * auVar82._0_4_;
  auVar95._4_4_ = auVar60._4_4_ * auVar82._4_4_;
  auVar95._8_4_ = auVar60._8_4_ * auVar82._8_4_;
  auVar95._12_4_ = auVar60._12_4_ * auVar82._12_4_;
  auVar95._16_4_ = auVar82._16_4_ * 0.0;
  auVar95._20_4_ = auVar82._20_4_ * 0.0;
  auVar95._24_4_ = auVar82._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 + uVar46 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar56));
  auVar89._4_4_ = auVar82._4_4_ * auVar59._4_4_;
  auVar89._0_4_ = auVar82._0_4_ * auVar59._0_4_;
  auVar89._8_4_ = auVar82._8_4_ * auVar59._8_4_;
  auVar89._12_4_ = auVar82._12_4_ * auVar59._12_4_;
  auVar89._16_4_ = auVar82._16_4_ * 0.0;
  auVar89._20_4_ = auVar82._20_4_ * 0.0;
  auVar89._24_4_ = auVar82._24_4_ * 0.0;
  auVar89._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar46 * 0x17 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar56));
  auVar94._0_4_ = auVar59._0_4_ * auVar82._0_4_;
  auVar94._4_4_ = auVar59._4_4_ * auVar82._4_4_;
  auVar94._8_4_ = auVar59._8_4_ * auVar82._8_4_;
  auVar94._12_4_ = auVar59._12_4_ * auVar82._12_4_;
  auVar94._16_4_ = auVar82._16_4_ * 0.0;
  auVar94._20_4_ = auVar82._20_4_ * 0.0;
  auVar94._24_4_ = auVar82._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar82 = vpminsd_avx2(auVar87,auVar99);
  auVar80 = vpminsd_avx2(auVar88,auVar95);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80 = vpminsd_avx2(auVar89,auVar94);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar96._4_4_ = uVar126;
  auVar96._0_4_ = uVar126;
  auVar96._8_4_ = uVar126;
  auVar96._12_4_ = uVar126;
  auVar96._16_4_ = uVar126;
  auVar96._20_4_ = uVar126;
  auVar96._24_4_ = uVar126;
  auVar96._28_4_ = uVar126;
  auVar80 = vmaxps_avx512vl(auVar80,auVar96);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  auVar80._16_4_ = 0x3f7ffffa;
  auVar80._20_4_ = 0x3f7ffffa;
  auVar80._24_4_ = 0x3f7ffffa;
  auVar80._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar82,auVar80);
  auVar82 = vpmaxsd_avx2(auVar87,auVar99);
  auVar80 = vpmaxsd_avx2(auVar88,auVar95);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar80 = vpmaxsd_avx2(auVar89,auVar94);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar97._4_4_ = uVar126;
  auVar97._0_4_ = uVar126;
  auVar97._8_4_ = uVar126;
  auVar97._12_4_ = uVar126;
  auVar97._16_4_ = uVar126;
  auVar97._20_4_ = uVar126;
  auVar97._24_4_ = uVar126;
  auVar97._28_4_ = uVar126;
  auVar80 = vminps_avx512vl(auVar80,auVar97);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar98);
  uVar19 = vpcmpgtd_avx512vl(auVar81,_DAT_0205a920);
  uVar18 = vcmpps_avx512vl(local_200,auVar82,2);
  if ((byte)((byte)uVar18 & (byte)uVar19) == 0) {
    return;
  }
  uVar48 = (ulong)(byte)((byte)uVar18 & (byte)uVar19);
  local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar60 = auVar82._16_16_;
  auVar49 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar268 = ZEXT1664(auVar49);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar260 = ZEXT1664(auVar49);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar261 = ZEXT1664(auVar49);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar262 = ZEXT1664(auVar49);
  auVar49 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar267 = ZEXT1664(auVar49);
LAB_01d2fc99:
  lVar45 = 0;
  for (uVar42 = uVar48; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
    lVar45 = lVar45 + 1;
  }
  uVar47 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar45 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar47].ptr;
  uVar42 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar49 = *(undefined1 (*) [16])(_Var9 + uVar42 * (long)pvVar8);
  auVar59 = *(undefined1 (*) [16])(_Var9 + (uVar42 + 1) * (long)pvVar8);
  auVar58 = *(undefined1 (*) [16])(_Var9 + (uVar42 + 2) * (long)pvVar8);
  auVar57 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar42 + 3));
  lVar45 = *(long *)&pGVar6[1].time_range.upper;
  auVar56 = *(undefined1 (*) [16])(lVar45 + (long)p_Var7 * uVar42);
  auVar55 = *(undefined1 (*) [16])(lVar45 + (long)p_Var7 * (uVar42 + 1));
  auVar54 = *(undefined1 (*) [16])(lVar45 + (long)p_Var7 * (uVar42 + 2));
  uVar48 = uVar48 - 1 & uVar48;
  auVar53 = *(undefined1 (*) [16])(lVar45 + (long)p_Var7 * (uVar42 + 3));
  if (uVar48 != 0) {
    uVar46 = uVar48 - 1 & uVar48;
    for (uVar42 = uVar48; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
    }
    if (uVar46 != 0) {
      for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar122 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar122 = vinsertps_avx(auVar122,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar144 = *(float *)(ray + k * 4 + 0x60);
  auVar61 = auVar268._0_16_;
  auVar50 = vmulps_avx512vl(auVar53,auVar61);
  auVar51 = vfmadd231ps_avx512vl(auVar50,auVar54,auVar61);
  auVar50 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar55,auVar51);
  auVar136._0_4_ = auVar56._0_4_ + auVar50._0_4_;
  auVar136._4_4_ = auVar56._4_4_ + auVar50._4_4_;
  auVar136._8_4_ = auVar56._8_4_ + auVar50._8_4_;
  auVar136._12_4_ = auVar56._12_4_ + auVar50._12_4_;
  auVar127 = auVar260._0_16_;
  auVar50 = vfmadd231ps_avx512vl(auVar51,auVar55,auVar127);
  auVar51 = vfnmadd231ps_avx512vl(auVar50,auVar56,auVar127);
  auVar50 = vmulps_avx512vl(auVar57,auVar61);
  auVar52 = vfmadd231ps_avx512vl(auVar50,auVar58,auVar61);
  auVar50 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar59,auVar52);
  auVar244._0_4_ = auVar49._0_4_ + auVar50._0_4_;
  auVar244._4_4_ = auVar49._4_4_ + auVar50._4_4_;
  auVar244._8_4_ = auVar49._8_4_ + auVar50._8_4_;
  auVar244._12_4_ = auVar49._12_4_ + auVar50._12_4_;
  auVar50 = vfmadd231ps_avx512vl(auVar52,auVar59,auVar127);
  auVar52 = vfnmadd231ps_avx512vl(auVar50,auVar49,auVar127);
  auVar50 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar54,auVar53);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar55,auVar61);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar56,auVar61);
  auVar53 = vmulps_avx512vl(auVar53,auVar127);
  auVar54 = vfnmadd231ps_avx512vl(auVar53,auVar127,auVar54);
  auVar55 = vfmadd231ps_avx512vl(auVar54,auVar61,auVar55);
  auVar54 = vfnmadd231ps_avx512vl(auVar55,auVar61,auVar56);
  auVar56 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar58,auVar57);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar59,auVar61);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar61);
  auVar57 = vmulps_avx512vl(auVar57,auVar127);
  auVar58 = vfnmadd231ps_avx512vl(auVar57,auVar127,auVar58);
  auVar59 = vfmadd231ps_avx512vl(auVar58,auVar61,auVar59);
  auVar55 = vfnmadd231ps_avx512vl(auVar59,auVar61,auVar49);
  auVar49 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar59 = vshufps_avx(auVar244,auVar244,0xc9);
  fVar124 = auVar51._0_4_;
  auVar71._0_4_ = fVar124 * auVar59._0_4_;
  fVar125 = auVar51._4_4_;
  auVar71._4_4_ = fVar125 * auVar59._4_4_;
  fVar223 = auVar51._8_4_;
  auVar71._8_4_ = fVar223 * auVar59._8_4_;
  fVar143 = auVar51._12_4_;
  auVar71._12_4_ = fVar143 * auVar59._12_4_;
  auVar59 = vfmsub231ps_fma(auVar71,auVar49,auVar244);
  auVar58 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar66._0_4_ = fVar124 * auVar59._0_4_;
  auVar66._4_4_ = fVar125 * auVar59._4_4_;
  auVar66._8_4_ = fVar223 * auVar59._8_4_;
  auVar66._12_4_ = fVar143 * auVar59._12_4_;
  auVar49 = vfmsub231ps_fma(auVar66,auVar49,auVar52);
  auVar57 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar59 = vshufps_avx(auVar56,auVar56,0xc9);
  fVar224 = auVar54._0_4_;
  auVar74._0_4_ = fVar224 * auVar59._0_4_;
  fVar162 = auVar54._4_4_;
  auVar74._4_4_ = fVar162 * auVar59._4_4_;
  fVar163 = auVar54._8_4_;
  auVar74._8_4_ = fVar163 * auVar59._8_4_;
  fVar164 = auVar54._12_4_;
  auVar74._12_4_ = fVar164 * auVar59._12_4_;
  auVar59 = vfmsub231ps_fma(auVar74,auVar49,auVar56);
  auVar56 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar204._0_4_ = auVar59._0_4_ * fVar224;
  auVar204._4_4_ = auVar59._4_4_ * fVar162;
  auVar204._8_4_ = auVar59._8_4_ * fVar163;
  auVar204._12_4_ = auVar59._12_4_ * fVar164;
  auVar59 = vfmsub231ps_fma(auVar204,auVar49,auVar55);
  auVar49 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar55 = vshufps_avx(auVar59,auVar59,0xc9);
  fVar121 = auVar49._0_4_;
  auVar84._16_16_ = auVar60;
  auVar84._0_16_ = auVar61;
  auVar83._4_28_ = auVar84._4_28_;
  auVar83._0_4_ = fVar121;
  auVar59 = vrsqrt14ss_avx512f(auVar61,auVar83._0_16_);
  fVar210 = auVar59._0_4_;
  auVar53 = vmulss_avx512f(auVar49,ZEXT416(0x3f000000));
  auVar59 = vdpps_avx(auVar58,auVar57,0x7f);
  fVar221 = fVar210 * 1.5 - auVar53._0_4_ * fVar210 * fVar210 * fVar210;
  fVar231 = fVar221 * auVar58._0_4_;
  fVar240 = fVar221 * auVar58._4_4_;
  fVar241 = fVar221 * auVar58._8_4_;
  fVar242 = fVar221 * auVar58._12_4_;
  auVar211._0_4_ = auVar57._0_4_ * fVar121;
  auVar211._4_4_ = auVar57._4_4_ * fVar121;
  auVar211._8_4_ = auVar57._8_4_ * fVar121;
  auVar211._12_4_ = auVar57._12_4_ * fVar121;
  fVar121 = auVar59._0_4_;
  auVar179._0_4_ = fVar121 * auVar58._0_4_;
  auVar179._4_4_ = fVar121 * auVar58._4_4_;
  auVar179._8_4_ = fVar121 * auVar58._8_4_;
  auVar179._12_4_ = fVar121 * auVar58._12_4_;
  auVar59 = vsubps_avx(auVar211,auVar179);
  auVar58 = vrcp14ss_avx512f(auVar61,auVar83._0_16_);
  auVar49 = vfnmadd213ss_avx512f(auVar49,auVar58,ZEXT416(0x40000000));
  fVar121 = auVar58._0_4_ * auVar49._0_4_;
  auVar49 = vdpps_avx(auVar56,auVar56,0x7f);
  fVar210 = auVar49._0_4_;
  auVar86._16_16_ = auVar60;
  auVar86._0_16_ = auVar61;
  auVar85._4_28_ = auVar86._4_28_;
  auVar85._0_4_ = fVar210;
  auVar60 = vrsqrt14ss_avx512f(auVar61,auVar85._0_16_);
  fVar222 = auVar60._0_4_;
  auVar60 = vmulss_avx512f(auVar49,ZEXT416(0x3f000000));
  fVar222 = fVar222 * 1.5 - auVar60._0_4_ * fVar222 * fVar222 * fVar222;
  auVar60 = vdpps_avx(auVar56,auVar55,0x7f);
  fVar243 = fVar222 * auVar56._0_4_;
  fVar249 = fVar222 * auVar56._4_4_;
  fVar250 = fVar222 * auVar56._8_4_;
  fVar251 = fVar222 * auVar56._12_4_;
  auVar67._0_4_ = fVar210 * auVar55._0_4_;
  auVar67._4_4_ = fVar210 * auVar55._4_4_;
  auVar67._8_4_ = fVar210 * auVar55._8_4_;
  auVar67._12_4_ = fVar210 * auVar55._12_4_;
  fVar210 = auVar60._0_4_;
  auVar75._0_4_ = fVar210 * auVar56._0_4_;
  auVar75._4_4_ = fVar210 * auVar56._4_4_;
  auVar75._8_4_ = fVar210 * auVar56._8_4_;
  auVar75._12_4_ = fVar210 * auVar56._12_4_;
  auVar58 = vsubps_avx(auVar67,auVar75);
  auVar60 = vrcp14ss_avx512f(auVar61,auVar85._0_16_);
  auVar49 = vfnmadd213ss_avx512f(auVar49,auVar60,ZEXT416(0x40000000));
  fVar210 = auVar49._0_4_ * auVar60._0_4_;
  auVar49 = vshufps_avx(auVar136,auVar136,0xff);
  auVar189._0_4_ = fVar231 * auVar49._0_4_;
  auVar189._4_4_ = fVar240 * auVar49._4_4_;
  auVar189._8_4_ = fVar241 * auVar49._8_4_;
  auVar189._12_4_ = fVar242 * auVar49._12_4_;
  local_310 = vsubps_avx(auVar136,auVar189);
  auVar60 = vshufps_avx(auVar51,auVar51,0xff);
  auVar68._0_4_ = auVar60._0_4_ * fVar231 + auVar49._0_4_ * fVar221 * fVar121 * auVar59._0_4_;
  auVar68._4_4_ = auVar60._4_4_ * fVar240 + auVar49._4_4_ * fVar221 * fVar121 * auVar59._4_4_;
  auVar68._8_4_ = auVar60._8_4_ * fVar241 + auVar49._8_4_ * fVar221 * fVar121 * auVar59._8_4_;
  auVar68._12_4_ = auVar60._12_4_ * fVar242 + auVar49._12_4_ * fVar221 * fVar121 * auVar59._12_4_;
  auVar59 = vsubps_avx(auVar51,auVar68);
  local_320._0_4_ = auVar189._0_4_ + auVar136._0_4_;
  local_320._4_4_ = auVar189._4_4_ + auVar136._4_4_;
  fStack_318 = auVar189._8_4_ + auVar136._8_4_;
  fStack_314 = auVar189._12_4_ + auVar136._12_4_;
  auVar49 = vshufps_avx(auVar50,auVar50,0xff);
  auVar172._0_4_ = fVar243 * auVar49._0_4_;
  auVar172._4_4_ = fVar249 * auVar49._4_4_;
  auVar172._8_4_ = fVar250 * auVar49._8_4_;
  auVar172._12_4_ = fVar251 * auVar49._12_4_;
  local_330 = vsubps_avx512vl(auVar50,auVar172);
  auVar60 = vshufps_avx(auVar54,auVar54,0xff);
  auVar61._0_4_ = auVar60._0_4_ * fVar243 + auVar49._0_4_ * fVar222 * auVar58._0_4_ * fVar210;
  auVar61._4_4_ = auVar60._4_4_ * fVar249 + auVar49._4_4_ * fVar222 * auVar58._4_4_ * fVar210;
  auVar61._8_4_ = auVar60._8_4_ * fVar250 + auVar49._8_4_ * fVar222 * auVar58._8_4_ * fVar210;
  auVar61._12_4_ = auVar60._12_4_ * fVar251 + auVar49._12_4_ * fVar222 * auVar58._12_4_ * fVar210;
  auVar49 = vsubps_avx(auVar54,auVar61);
  local_340._0_4_ = auVar50._0_4_ + auVar172._0_4_;
  local_340._4_4_ = auVar50._4_4_ + auVar172._4_4_;
  fStack_338 = auVar50._8_4_ + auVar172._8_4_;
  fStack_334 = auVar50._12_4_ + auVar172._12_4_;
  auVar63._0_4_ = auVar59._0_4_ * 0.33333334;
  auVar63._4_4_ = auVar59._4_4_ * 0.33333334;
  auVar63._8_4_ = auVar59._8_4_ * 0.33333334;
  auVar63._12_4_ = auVar59._12_4_ * 0.33333334;
  local_350 = vaddps_avx512vl(local_310,auVar63);
  auVar72._0_4_ = auVar49._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar49._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar49._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar49._12_4_ * 0.33333334;
  local_360 = vsubps_avx512vl(local_330,auVar72);
  auVar50._0_4_ = (fVar124 + auVar68._0_4_) * 0.33333334;
  auVar50._4_4_ = (fVar125 + auVar68._4_4_) * 0.33333334;
  auVar50._8_4_ = (fVar223 + auVar68._8_4_) * 0.33333334;
  auVar50._12_4_ = (fVar143 + auVar68._12_4_) * 0.33333334;
  _local_370 = vaddps_avx512vl(_local_320,auVar50);
  auVar51._0_4_ = (fVar224 + auVar61._0_4_) * 0.33333334;
  auVar51._4_4_ = (fVar162 + auVar61._4_4_) * 0.33333334;
  auVar51._8_4_ = (fVar163 + auVar61._8_4_) * 0.33333334;
  auVar51._12_4_ = (fVar164 + auVar61._12_4_) * 0.33333334;
  _local_380 = vsubps_avx512vl(_local_340,auVar51);
  local_290 = vsubps_avx(local_310,auVar122);
  uVar126 = local_290._0_4_;
  auVar62._4_4_ = uVar126;
  auVar62._0_4_ = uVar126;
  auVar62._8_4_ = uVar126;
  auVar62._12_4_ = uVar126;
  auVar49 = vshufps_avx(local_290,local_290,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar60 = vshufps_avx(local_290,local_290,0xaa);
  fVar121 = pre->ray_space[k].vz.field_0.m128[0];
  fVar210 = pre->ray_space[k].vz.field_0.m128[1];
  fVar221 = pre->ray_space[k].vz.field_0.m128[2];
  fVar222 = pre->ray_space[k].vz.field_0.m128[3];
  auVar52._0_4_ = fVar121 * auVar60._0_4_;
  auVar52._4_4_ = fVar210 * auVar60._4_4_;
  auVar52._8_4_ = fVar221 * auVar60._8_4_;
  auVar52._12_4_ = fVar222 * auVar60._12_4_;
  auVar49 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar2,auVar49);
  auVar55 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar62);
  local_2a0 = vsubps_avx512vl(local_350,auVar122);
  uVar126 = local_2a0._0_4_;
  auVar64._4_4_ = uVar126;
  auVar64._0_4_ = uVar126;
  auVar64._8_4_ = uVar126;
  auVar64._12_4_ = uVar126;
  auVar49 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar60 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar65._0_4_ = fVar121 * auVar60._0_4_;
  auVar65._4_4_ = fVar210 * auVar60._4_4_;
  auVar65._8_4_ = fVar221 * auVar60._8_4_;
  auVar65._12_4_ = fVar222 * auVar60._12_4_;
  auVar49 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar49);
  auVar54 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar64);
  local_2b0 = vsubps_avx512vl(local_360,auVar122);
  uVar126 = local_2b0._0_4_;
  auVar69._4_4_ = uVar126;
  auVar69._0_4_ = uVar126;
  auVar69._8_4_ = uVar126;
  auVar69._12_4_ = uVar126;
  auVar49 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar60 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar73._0_4_ = fVar121 * auVar60._0_4_;
  auVar73._4_4_ = fVar210 * auVar60._4_4_;
  auVar73._8_4_ = fVar221 * auVar60._8_4_;
  auVar73._12_4_ = fVar222 * auVar60._12_4_;
  auVar49 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar2,auVar49);
  auVar53 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar69);
  local_2c0 = vsubps_avx512vl(local_330,auVar122);
  uVar126 = local_2c0._0_4_;
  auVar190._4_4_ = uVar126;
  auVar190._0_4_ = uVar126;
  auVar190._8_4_ = uVar126;
  auVar190._12_4_ = uVar126;
  auVar49 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar60 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar70._0_4_ = fVar121 * auVar60._0_4_;
  auVar70._4_4_ = fVar210 * auVar60._4_4_;
  auVar70._8_4_ = fVar221 * auVar60._8_4_;
  auVar70._12_4_ = fVar222 * auVar60._12_4_;
  auVar49 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar49);
  auVar50 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar190);
  local_2d0 = vsubps_avx(_local_320,auVar122);
  uVar126 = local_2d0._0_4_;
  auVar191._4_4_ = uVar126;
  auVar191._0_4_ = uVar126;
  auVar191._8_4_ = uVar126;
  auVar191._12_4_ = uVar126;
  auVar49 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar60 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar212._0_4_ = auVar60._0_4_ * fVar121;
  auVar212._4_4_ = auVar60._4_4_ * fVar210;
  auVar212._8_4_ = auVar60._8_4_ * fVar221;
  auVar212._12_4_ = auVar60._12_4_ * fVar222;
  auVar49 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar49);
  auVar51 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar191);
  local_2e0 = vsubps_avx512vl(_local_370,auVar122);
  uVar126 = local_2e0._0_4_;
  auVar192._4_4_ = uVar126;
  auVar192._0_4_ = uVar126;
  auVar192._8_4_ = uVar126;
  auVar192._12_4_ = uVar126;
  auVar49 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar60 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar225._0_4_ = auVar60._0_4_ * fVar121;
  auVar225._4_4_ = auVar60._4_4_ * fVar210;
  auVar225._8_4_ = auVar60._8_4_ * fVar221;
  auVar225._12_4_ = auVar60._12_4_ * fVar222;
  auVar49 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar2,auVar49);
  auVar52 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar192);
  local_2f0 = vsubps_avx512vl(_local_380,auVar122);
  uVar126 = local_2f0._0_4_;
  auVar193._4_4_ = uVar126;
  auVar193._0_4_ = uVar126;
  auVar193._8_4_ = uVar126;
  auVar193._12_4_ = uVar126;
  auVar49 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar60 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar232._0_4_ = auVar60._0_4_ * fVar121;
  auVar232._4_4_ = auVar60._4_4_ * fVar210;
  auVar232._8_4_ = auVar60._8_4_ * fVar221;
  auVar232._12_4_ = auVar60._12_4_ * fVar222;
  auVar49 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar2,auVar49);
  auVar136 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar193);
  local_300 = vsubps_avx(_local_340,auVar122);
  uVar126 = local_300._0_4_;
  auVar122._4_4_ = uVar126;
  auVar122._0_4_ = uVar126;
  auVar122._8_4_ = uVar126;
  auVar122._12_4_ = uVar126;
  auVar49 = vshufps_avx(local_300,local_300,0x55);
  auVar60 = vshufps_avx(local_300,local_300,0xaa);
  auVar76._0_4_ = auVar60._0_4_ * fVar121;
  auVar76._4_4_ = auVar60._4_4_ * fVar210;
  auVar76._8_4_ = auVar60._8_4_ * fVar221;
  auVar76._12_4_ = auVar60._12_4_ * fVar222;
  auVar49 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar2,auVar49);
  auVar122 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar122);
  auVar59 = vmovlhps_avx(auVar55,auVar51);
  auVar58 = vmovlhps_avx(auVar54,auVar52);
  auVar56 = vmovlhps_avx512f(auVar53,auVar136);
  _local_420 = vmovlhps_avx512f(auVar50,auVar122);
  auVar60 = vminps_avx(auVar59,auVar58);
  auVar49 = vmaxps_avx(auVar59,auVar58);
  auVar57 = vminps_avx512vl(auVar56,_local_420);
  auVar60 = vminps_avx(auVar60,auVar57);
  auVar57 = vmaxps_avx512vl(auVar56,_local_420);
  auVar49 = vmaxps_avx(auVar49,auVar57);
  auVar57 = vshufpd_avx(auVar60,auVar60,3);
  auVar60 = vminps_avx(auVar60,auVar57);
  auVar57 = vshufpd_avx(auVar49,auVar49,3);
  auVar49 = vmaxps_avx(auVar49,auVar57);
  auVar60 = vandps_avx512vl(auVar60,auVar261._0_16_);
  auVar49 = vandps_avx512vl(auVar49,auVar261._0_16_);
  auVar49 = vmaxps_avx(auVar60,auVar49);
  auVar60 = vmovshdup_avx(auVar49);
  auVar49 = vmaxss_avx(auVar60,auVar49);
  local_400 = vmovddup_avx512vl(auVar55);
  local_410 = vmovddup_avx512vl(auVar54);
  auVar127._8_8_ = auVar53._0_8_;
  auVar127._0_8_ = auVar53._0_8_;
  auVar173._0_8_ = auVar50._0_8_;
  auVar173._8_8_ = auVar173._0_8_;
  local_430 = ZEXT416((uint)(auVar49._0_4_ * 9.536743e-07));
  local_1c0 = vbroadcastss_avx512vl(local_430);
  auVar49 = vxorps_avx512vl(local_1c0._0_16_,auVar262._0_16_);
  local_1e0 = vbroadcastss_avx512vl(auVar49);
  uVar42 = 0;
  auVar49 = vsubps_avx(auVar58,auVar59);
  auVar57 = vsubps_avx512vl(auVar56,auVar58);
  auVar55 = vsubps_avx512vl(_local_420,auVar56);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_220 = vpbroadcastd_avx512vl();
  local_240 = vpbroadcastd_avx512vl();
  auVar60 = ZEXT816(0x3f80000000000000);
  auVar259 = ZEXT1664(auVar60);
  do {
    auVar72 = auVar259._0_16_;
    auVar54 = vshufps_avx(auVar72,auVar72,0x50);
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar53 = vsubps_avx512vl(auVar87._0_16_,auVar54);
    fVar121 = auVar54._0_4_;
    fVar124 = auVar51._0_4_;
    auVar145._0_4_ = fVar124 * fVar121;
    fVar210 = auVar54._4_4_;
    fVar125 = auVar51._4_4_;
    auVar145._4_4_ = fVar125 * fVar210;
    fVar221 = auVar54._8_4_;
    auVar145._8_4_ = fVar124 * fVar221;
    fVar222 = auVar54._12_4_;
    auVar145._12_4_ = fVar125 * fVar222;
    fVar162 = auVar52._0_4_;
    auVar155._0_4_ = fVar162 * fVar121;
    fVar163 = auVar52._4_4_;
    auVar155._4_4_ = fVar163 * fVar210;
    auVar155._8_4_ = fVar162 * fVar221;
    auVar155._12_4_ = fVar163 * fVar222;
    fVar164 = auVar136._0_4_;
    auVar165._0_4_ = fVar164 * fVar121;
    fVar231 = auVar136._4_4_;
    auVar165._4_4_ = fVar231 * fVar210;
    auVar165._8_4_ = fVar164 * fVar221;
    auVar165._12_4_ = fVar231 * fVar222;
    fVar240 = auVar122._0_4_;
    auVar128._0_4_ = fVar240 * fVar121;
    fVar241 = auVar122._4_4_;
    auVar128._4_4_ = fVar241 * fVar210;
    auVar128._8_4_ = fVar240 * fVar221;
    auVar128._12_4_ = fVar241 * fVar222;
    auVar50 = vfmadd231ps_avx512vl(auVar145,auVar53,local_400);
    auVar61 = vfmadd231ps_avx512vl(auVar155,auVar53,local_410);
    auVar62 = vfmadd231ps_avx512vl(auVar165,auVar53,auVar127);
    auVar53 = vfmadd231ps_fma(auVar128,auVar173,auVar53);
    auVar54 = vmovshdup_avx(auVar60);
    fVar210 = auVar60._0_4_;
    fVar121 = (auVar54._0_4_ - fVar210) * 0.04761905;
    auVar188._4_4_ = fVar210;
    auVar188._0_4_ = fVar210;
    auVar188._8_4_ = fVar210;
    auVar188._12_4_ = fVar210;
    auVar188._16_4_ = fVar210;
    auVar188._20_4_ = fVar210;
    auVar188._24_4_ = fVar210;
    auVar188._28_4_ = fVar210;
    auVar140._0_8_ = auVar54._0_8_;
    auVar140._8_8_ = auVar140._0_8_;
    auVar140._16_8_ = auVar140._0_8_;
    auVar140._24_8_ = auVar140._0_8_;
    auVar82 = vsubps_avx(auVar140,auVar188);
    uVar126 = auVar50._0_4_;
    auVar141._4_4_ = uVar126;
    auVar141._0_4_ = uVar126;
    auVar141._8_4_ = uVar126;
    auVar141._12_4_ = uVar126;
    auVar141._16_4_ = uVar126;
    auVar141._20_4_ = uVar126;
    auVar141._24_4_ = uVar126;
    auVar141._28_4_ = uVar126;
    auVar207._8_4_ = 1;
    auVar207._0_8_ = 0x100000001;
    auVar207._12_4_ = 1;
    auVar207._16_4_ = 1;
    auVar207._20_4_ = 1;
    auVar207._24_4_ = 1;
    auVar207._28_4_ = 1;
    auVar96 = ZEXT1632(auVar50);
    auVar80 = vpermps_avx2(auVar207,auVar96);
    auVar88 = vbroadcastss_avx512vl(auVar61);
    auVar97 = ZEXT1632(auVar61);
    auVar89 = vpermps_avx512vl(auVar207,auVar97);
    auVar90 = vbroadcastss_avx512vl(auVar62);
    auVar81 = ZEXT1632(auVar62);
    auVar79 = vpermps_avx512vl(auVar207,auVar81);
    auVar91 = vbroadcastss_avx512vl(auVar53);
    auVar94 = ZEXT1632(auVar53);
    auVar92 = vpermps_avx512vl(auVar207,auVar94);
    auVar208._4_4_ = fVar121;
    auVar208._0_4_ = fVar121;
    auVar208._8_4_ = fVar121;
    auVar208._12_4_ = fVar121;
    auVar208._16_4_ = fVar121;
    auVar208._20_4_ = fVar121;
    auVar208._24_4_ = fVar121;
    auVar208._28_4_ = fVar121;
    auVar248._8_4_ = 2;
    auVar248._0_8_ = 0x200000002;
    auVar248._12_4_ = 2;
    auVar248._16_4_ = 2;
    auVar248._20_4_ = 2;
    auVar248._24_4_ = 2;
    auVar248._28_4_ = 2;
    auVar77 = vpermps_avx512vl(auVar248,auVar96);
    auVar177._8_4_ = 3;
    auVar177._0_8_ = 0x300000003;
    auVar177._12_4_ = 3;
    auVar177._16_4_ = 3;
    auVar177._20_4_ = 3;
    auVar177._24_4_ = 3;
    auVar177._28_4_ = 3;
    auVar78 = vpermps_avx512vl(auVar177,auVar96);
    auVar96 = vpermps_avx2(auVar248,auVar97);
    auVar97 = vpermps_avx2(auVar177,auVar97);
    auVar98 = vpermps_avx2(auVar248,auVar81);
    auVar81 = vpermps_avx2(auVar177,auVar81);
    auVar93 = vpermps_avx512vl(auVar248,auVar94);
    auVar94 = vpermps_avx512vl(auVar177,auVar94);
    auVar54 = vfmadd132ps_fma(auVar82,auVar188,_DAT_02020f20);
    auVar87 = vsubps_avx512vl(auVar87,ZEXT1632(auVar54));
    auVar82 = vmulps_avx512vl(auVar88,ZEXT1632(auVar54));
    auVar99 = ZEXT1632(auVar54);
    auVar95 = vmulps_avx512vl(auVar89,auVar99);
    auVar53 = vfmadd231ps_fma(auVar82,auVar87,auVar141);
    auVar50 = vfmadd231ps_fma(auVar95,auVar87,auVar80);
    auVar82 = vmulps_avx512vl(auVar90,auVar99);
    auVar95 = vmulps_avx512vl(auVar79,auVar99);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar87,auVar88);
    auVar88 = vfmadd231ps_avx512vl(auVar95,auVar87,auVar89);
    auVar89 = vmulps_avx512vl(auVar91,auVar99);
    auVar95 = ZEXT1632(auVar54);
    auVar92 = vmulps_avx512vl(auVar92,auVar95);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar90);
    auVar90 = vfmadd231ps_avx512vl(auVar92,auVar87,auVar79);
    fVar221 = auVar54._0_4_;
    fVar222 = auVar54._4_4_;
    auVar22._4_4_ = fVar222 * auVar82._4_4_;
    auVar22._0_4_ = fVar221 * auVar82._0_4_;
    fVar223 = auVar54._8_4_;
    auVar22._8_4_ = fVar223 * auVar82._8_4_;
    fVar143 = auVar54._12_4_;
    auVar22._12_4_ = fVar143 * auVar82._12_4_;
    auVar22._16_4_ = auVar82._16_4_ * 0.0;
    auVar22._20_4_ = auVar82._20_4_ * 0.0;
    auVar22._24_4_ = auVar82._24_4_ * 0.0;
    auVar22._28_4_ = fVar210;
    auVar23._4_4_ = fVar222 * auVar88._4_4_;
    auVar23._0_4_ = fVar221 * auVar88._0_4_;
    auVar23._8_4_ = fVar223 * auVar88._8_4_;
    auVar23._12_4_ = fVar143 * auVar88._12_4_;
    auVar23._16_4_ = auVar88._16_4_ * 0.0;
    auVar23._20_4_ = auVar88._20_4_ * 0.0;
    auVar23._24_4_ = auVar88._24_4_ * 0.0;
    auVar23._28_4_ = auVar80._28_4_;
    auVar53 = vfmadd231ps_fma(auVar22,auVar87,ZEXT1632(auVar53));
    auVar50 = vfmadd231ps_fma(auVar23,auVar87,ZEXT1632(auVar50));
    auVar134._0_4_ = fVar221 * auVar89._0_4_;
    auVar134._4_4_ = fVar222 * auVar89._4_4_;
    auVar134._8_4_ = fVar223 * auVar89._8_4_;
    auVar134._12_4_ = fVar143 * auVar89._12_4_;
    auVar134._16_4_ = auVar89._16_4_ * 0.0;
    auVar134._20_4_ = auVar89._20_4_ * 0.0;
    auVar134._24_4_ = auVar89._24_4_ * 0.0;
    auVar134._28_4_ = 0;
    auVar24._4_4_ = fVar222 * auVar90._4_4_;
    auVar24._0_4_ = fVar221 * auVar90._0_4_;
    auVar24._8_4_ = fVar223 * auVar90._8_4_;
    auVar24._12_4_ = fVar143 * auVar90._12_4_;
    auVar24._16_4_ = auVar90._16_4_ * 0.0;
    auVar24._20_4_ = auVar90._20_4_ * 0.0;
    auVar24._24_4_ = auVar90._24_4_ * 0.0;
    auVar24._28_4_ = auVar89._28_4_;
    auVar61 = vfmadd231ps_fma(auVar134,auVar87,auVar82);
    auVar62 = vfmadd231ps_fma(auVar24,auVar87,auVar88);
    auVar25._28_4_ = auVar88._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar143 * auVar62._12_4_,
                            CONCAT48(fVar223 * auVar62._8_4_,
                                     CONCAT44(fVar222 * auVar62._4_4_,fVar221 * auVar62._0_4_))));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar61._12_4_,
                                                 CONCAT48(fVar223 * auVar61._8_4_,
                                                          CONCAT44(fVar222 * auVar61._4_4_,
                                                                   fVar221 * auVar61._0_4_)))),
                              auVar87,ZEXT1632(auVar53));
    auVar63 = vfmadd231ps_fma(auVar25,auVar87,ZEXT1632(auVar50));
    auVar82 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar53));
    auVar80 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar50));
    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar82 = vmulps_avx512vl(auVar82,auVar88);
    auVar80 = vmulps_avx512vl(auVar80,auVar88);
    auVar203._0_4_ = fVar121 * auVar82._0_4_;
    auVar203._4_4_ = fVar121 * auVar82._4_4_;
    auVar203._8_4_ = fVar121 * auVar82._8_4_;
    auVar203._12_4_ = fVar121 * auVar82._12_4_;
    auVar203._16_4_ = fVar121 * auVar82._16_4_;
    auVar203._20_4_ = fVar121 * auVar82._20_4_;
    auVar203._24_4_ = fVar121 * auVar82._24_4_;
    auVar203._28_4_ = 0;
    auVar82 = vmulps_avx512vl(auVar208,auVar80);
    auVar61 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
    auVar89 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_0205fd20,ZEXT1632(auVar61));
    auVar90 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_0205fd20,ZEXT1632(auVar61));
    auVar135._0_4_ = auVar203._0_4_ + auVar65._0_4_;
    auVar135._4_4_ = auVar203._4_4_ + auVar65._4_4_;
    auVar135._8_4_ = auVar203._8_4_ + auVar65._8_4_;
    auVar135._12_4_ = auVar203._12_4_ + auVar65._12_4_;
    auVar135._16_4_ = auVar203._16_4_ + 0.0;
    auVar135._20_4_ = auVar203._20_4_ + 0.0;
    auVar135._24_4_ = auVar203._24_4_ + 0.0;
    auVar135._28_4_ = 0;
    auVar99 = ZEXT1632(auVar61);
    auVar80 = vpermt2ps_avx512vl(auVar203,_DAT_0205fd20,auVar99);
    auVar79 = vaddps_avx512vl(ZEXT1632(auVar63),auVar82);
    auVar91 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,auVar99);
    auVar82 = vsubps_avx(auVar89,auVar80);
    auVar91 = vsubps_avx512vl(auVar90,auVar91);
    auVar80 = vmulps_avx512vl(auVar96,auVar95);
    auVar92 = vmulps_avx512vl(auVar97,auVar95);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar87,auVar77);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,auVar78);
    auVar77 = vmulps_avx512vl(auVar98,auVar95);
    auVar78 = vmulps_avx512vl(auVar81,auVar95);
    auVar96 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar78,auVar87,auVar97);
    auVar77 = vmulps_avx512vl(auVar93,auVar95);
    auVar78 = vmulps_avx512vl(auVar94,auVar95);
    auVar53 = vfmadd231ps_fma(auVar77,auVar87,auVar98);
    auVar50 = vfmadd231ps_fma(auVar78,auVar87,auVar81);
    auVar77 = vmulps_avx512vl(auVar95,auVar96);
    auVar78 = vmulps_avx512vl(ZEXT1632(auVar54),auVar97);
    auVar80 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar80);
    auVar92 = vfmadd231ps_avx512vl(auVar78,auVar87,auVar92);
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar143 * auVar53._12_4_,
                                            CONCAT48(fVar223 * auVar53._8_4_,
                                                     CONCAT44(fVar222 * auVar53._4_4_,
                                                              fVar221 * auVar53._0_4_)))),auVar87,
                         auVar96);
    auVar97 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar143 * auVar50._12_4_,
                                            CONCAT48(fVar223 * auVar50._8_4_,
                                                     CONCAT44(fVar222 * auVar50._4_4_,
                                                              fVar221 * auVar50._0_4_)))),auVar87,
                         auVar97);
    auVar26._4_4_ = fVar222 * auVar96._4_4_;
    auVar26._0_4_ = fVar221 * auVar96._0_4_;
    auVar26._8_4_ = fVar223 * auVar96._8_4_;
    auVar26._12_4_ = fVar143 * auVar96._12_4_;
    auVar26._16_4_ = auVar96._16_4_ * 0.0;
    auVar26._20_4_ = auVar96._20_4_ * 0.0;
    auVar26._24_4_ = auVar96._24_4_ * 0.0;
    auVar26._28_4_ = auVar81._28_4_;
    auVar27._4_4_ = fVar222 * auVar97._4_4_;
    auVar27._0_4_ = fVar221 * auVar97._0_4_;
    auVar27._8_4_ = fVar223 * auVar97._8_4_;
    auVar27._12_4_ = fVar143 * auVar97._12_4_;
    auVar27._16_4_ = auVar97._16_4_ * 0.0;
    auVar27._20_4_ = auVar97._20_4_ * 0.0;
    auVar27._24_4_ = auVar97._24_4_ * 0.0;
    auVar27._28_4_ = auVar98._28_4_;
    auVar98 = vfmadd231ps_avx512vl(auVar26,auVar87,auVar80);
    auVar81 = vfmadd231ps_avx512vl(auVar27,auVar92,auVar87);
    auVar80 = vsubps_avx512vl(auVar96,auVar80);
    auVar96 = vsubps_avx512vl(auVar97,auVar92);
    auVar80 = vmulps_avx512vl(auVar80,auVar88);
    auVar96 = vmulps_avx512vl(auVar96,auVar88);
    fVar210 = fVar121 * auVar80._0_4_;
    fVar221 = fVar121 * auVar80._4_4_;
    auVar28._4_4_ = fVar221;
    auVar28._0_4_ = fVar210;
    fVar222 = fVar121 * auVar80._8_4_;
    auVar28._8_4_ = fVar222;
    fVar223 = fVar121 * auVar80._12_4_;
    auVar28._12_4_ = fVar223;
    fVar143 = fVar121 * auVar80._16_4_;
    auVar28._16_4_ = fVar143;
    fVar224 = fVar121 * auVar80._20_4_;
    auVar28._20_4_ = fVar224;
    fVar121 = fVar121 * auVar80._24_4_;
    auVar28._24_4_ = fVar121;
    auVar28._28_4_ = auVar80._28_4_;
    auVar96 = vmulps_avx512vl(auVar208,auVar96);
    auVar97 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,auVar99);
    auVar87 = vpermt2ps_avx512vl(auVar81,_DAT_0205fd20,auVar99);
    auVar209._0_4_ = auVar98._0_4_ + fVar210;
    auVar209._4_4_ = auVar98._4_4_ + fVar221;
    auVar209._8_4_ = auVar98._8_4_ + fVar222;
    auVar209._12_4_ = auVar98._12_4_ + fVar223;
    auVar209._16_4_ = auVar98._16_4_ + fVar143;
    auVar209._20_4_ = auVar98._20_4_ + fVar224;
    auVar209._24_4_ = auVar98._24_4_ + fVar121;
    auVar209._28_4_ = auVar98._28_4_ + auVar80._28_4_;
    auVar80 = vpermt2ps_avx512vl(auVar28,_DAT_0205fd20,ZEXT1632(auVar61));
    auVar88 = vaddps_avx512vl(auVar81,auVar96);
    auVar96 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,ZEXT1632(auVar61));
    auVar80 = vsubps_avx(auVar97,auVar80);
    auVar96 = vsubps_avx512vl(auVar87,auVar96);
    auVar152 = ZEXT1632(auVar65);
    auVar92 = vsubps_avx512vl(auVar98,auVar152);
    auVar159 = ZEXT1632(auVar63);
    auVar77 = vsubps_avx512vl(auVar81,auVar159);
    auVar78 = vsubps_avx512vl(auVar97,auVar89);
    auVar92 = vaddps_avx512vl(auVar92,auVar78);
    auVar78 = vsubps_avx512vl(auVar87,auVar90);
    auVar77 = vaddps_avx512vl(auVar77,auVar78);
    auVar78 = vmulps_avx512vl(auVar159,auVar92);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar152,auVar77);
    auVar93 = vmulps_avx512vl(auVar79,auVar92);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar135,auVar77);
    auVar94 = vmulps_avx512vl(auVar91,auVar92);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar82,auVar77);
    auVar95 = vmulps_avx512vl(auVar90,auVar92);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar89,auVar77);
    auVar99 = vmulps_avx512vl(auVar81,auVar92);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar98,auVar77);
    auVar100 = vmulps_avx512vl(auVar88,auVar92);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar209,auVar77);
    auVar101 = vmulps_avx512vl(auVar96,auVar92);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar80,auVar77);
    auVar92 = vmulps_avx512vl(auVar87,auVar92);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar97,auVar77);
    auVar77 = vminps_avx512vl(auVar78,auVar93);
    auVar78 = vmaxps_avx512vl(auVar78,auVar93);
    auVar93 = vminps_avx512vl(auVar94,auVar95);
    auVar77 = vminps_avx512vl(auVar77,auVar93);
    auVar93 = vmaxps_avx512vl(auVar94,auVar95);
    auVar78 = vmaxps_avx512vl(auVar78,auVar93);
    auVar93 = vminps_avx512vl(auVar99,auVar100);
    auVar94 = vmaxps_avx512vl(auVar99,auVar100);
    auVar95 = vminps_avx512vl(auVar101,auVar92);
    auVar93 = vminps_avx512vl(auVar93,auVar95);
    auVar77 = vminps_avx512vl(auVar77,auVar93);
    auVar92 = vmaxps_avx512vl(auVar101,auVar92);
    auVar92 = vmaxps_avx512vl(auVar94,auVar92);
    auVar92 = vmaxps_avx512vl(auVar78,auVar92);
    uVar18 = vcmpps_avx512vl(auVar77,local_1c0,2);
    uVar19 = vcmpps_avx512vl(auVar92,local_1e0,5);
    uVar119 = 0;
    bVar40 = (byte)uVar18 & (byte)uVar19 & 0x7f;
    if (bVar40 != 0) {
      auVar92 = vsubps_avx512vl(auVar89,auVar152);
      auVar77 = vsubps_avx512vl(auVar90,auVar159);
      auVar78 = vsubps_avx512vl(auVar97,auVar98);
      auVar92 = vaddps_avx512vl(auVar92,auVar78);
      auVar78 = vsubps_avx512vl(auVar87,auVar81);
      auVar77 = vaddps_avx512vl(auVar77,auVar78);
      auVar78 = vmulps_avx512vl(auVar159,auVar92);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar77,auVar152);
      auVar79 = vmulps_avx512vl(auVar79,auVar92);
      auVar79 = vfnmadd213ps_avx512vl(auVar135,auVar77,auVar79);
      auVar91 = vmulps_avx512vl(auVar91,auVar92);
      auVar91 = vfnmadd213ps_avx512vl(auVar82,auVar77,auVar91);
      auVar82 = vmulps_avx512vl(auVar90,auVar92);
      auVar89 = vfnmadd231ps_avx512vl(auVar82,auVar77,auVar89);
      auVar82 = vmulps_avx512vl(auVar81,auVar92);
      auVar98 = vfnmadd231ps_avx512vl(auVar82,auVar77,auVar98);
      auVar82 = vmulps_avx512vl(auVar88,auVar92);
      auVar81 = vfnmadd213ps_avx512vl(auVar209,auVar77,auVar82);
      auVar82 = vmulps_avx512vl(auVar96,auVar92);
      auVar88 = vfnmadd213ps_avx512vl(auVar80,auVar77,auVar82);
      auVar82 = vmulps_avx512vl(auVar87,auVar92);
      auVar87 = vfnmadd231ps_avx512vl(auVar82,auVar97,auVar77);
      auVar80 = vminps_avx(auVar78,auVar79);
      auVar82 = vmaxps_avx(auVar78,auVar79);
      auVar96 = vminps_avx(auVar91,auVar89);
      auVar96 = vminps_avx(auVar80,auVar96);
      auVar80 = vmaxps_avx(auVar91,auVar89);
      auVar82 = vmaxps_avx(auVar82,auVar80);
      auVar97 = vminps_avx(auVar98,auVar81);
      auVar80 = vmaxps_avx(auVar98,auVar81);
      auVar98 = vminps_avx(auVar88,auVar87);
      auVar97 = vminps_avx(auVar97,auVar98);
      auVar97 = vminps_avx(auVar96,auVar97);
      auVar96 = vmaxps_avx(auVar88,auVar87);
      auVar80 = vmaxps_avx(auVar80,auVar96);
      auVar82 = vmaxps_avx(auVar82,auVar80);
      uVar18 = vcmpps_avx512vl(auVar82,local_1e0,5);
      uVar19 = vcmpps_avx512vl(auVar97,local_1c0,2);
      uVar119 = (uint)(bVar40 & (byte)uVar18 & (byte)uVar19);
    }
    if (uVar119 != 0) {
      auStack_3f0[uVar42] = uVar119;
      uVar18 = vmovlps_avx(auVar60);
      *(undefined8 *)(&uStack_280 + uVar42 * 2) = uVar18;
      uVar46 = vmovlps_avx512f(auVar72);
      auStack_1a0[uVar42] = uVar46;
      uVar42 = (ulong)((int)uVar42 + 1);
    }
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar260 = ZEXT1664(auVar60);
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar261 = ZEXT1664(auVar60);
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar262 = ZEXT1664(auVar60);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar263 = ZEXT3264(auVar82);
    auVar264 = ZEXT464(0x3f800000);
    auVar60 = auVar82._16_16_;
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar265 = ZEXT1664(auVar54);
    do {
      auVar54 = auVar268._0_16_;
      if ((int)uVar42 == 0) {
        uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar21._4_4_ = uVar126;
        auVar21._0_4_ = uVar126;
        auVar21._8_4_ = uVar126;
        auVar21._12_4_ = uVar126;
        auVar21._16_4_ = uVar126;
        auVar21._20_4_ = uVar126;
        auVar21._24_4_ = uVar126;
        auVar21._28_4_ = uVar126;
        uVar18 = vcmpps_avx512vl(local_200,auVar21,2);
        uVar47 = (uint)uVar48 & (uint)uVar18;
        uVar48 = (ulong)uVar47;
        if (uVar47 == 0) {
          return;
        }
        goto LAB_01d2fc99;
      }
      uVar41 = (int)uVar42 - 1;
      uVar43 = (ulong)uVar41;
      uVar119 = (&uStack_280)[uVar43 * 2];
      fVar121 = afStack_27c[uVar43 * 2];
      uVar5 = auStack_3f0[uVar43];
      auVar257._8_8_ = 0;
      auVar257._0_8_ = auStack_1a0[uVar43];
      auVar259 = ZEXT1664(auVar257);
      lVar45 = 0;
      for (uVar46 = (ulong)uVar5; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
        lVar45 = lVar45 + 1;
      }
      uVar44 = uVar5 - 1 & uVar5;
      auStack_3f0[uVar43] = uVar44;
      if (uVar44 == 0) {
        uVar42 = (ulong)uVar41;
      }
      auVar137._0_4_ = (float)lVar45;
      auVar137._4_8_ = SUB128(ZEXT812(0),4);
      auVar137._12_4_ = 0;
      auVar60 = vmulss_avx512f(auVar137,SUB6416(ZEXT464(0x3e124925),0));
      lVar45 = lVar45 + 1;
      auVar53 = vmulss_avx512f(ZEXT416((uint)(float)lVar45),SUB6416(ZEXT464(0x3e124925),0));
      auVar62 = auVar264._0_16_;
      auVar50 = vsubss_avx512f(auVar62,auVar60);
      auVar60 = vmulss_avx512f(ZEXT416((uint)fVar121),auVar60);
      auVar50 = vfmadd231ss_avx512f(auVar60,ZEXT416(uVar119),auVar50);
      auVar60 = vsubss_avx512f(auVar62,auVar53);
      auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar121 * auVar53._0_4_)),ZEXT416(uVar119),auVar60);
      auVar61 = vsubss_avx512f(auVar53,auVar50);
      vucomiss_avx512f(auVar61);
      if (uVar5 == 0 || lVar45 == 0) break;
      auVar60 = vshufps_avx(auVar257,auVar257,0x50);
      vucomiss_avx512f(auVar61);
      auVar179 = auVar265._0_16_;
      auVar63 = vsubps_avx512vl(auVar179,auVar60);
      fVar121 = auVar60._0_4_;
      auVar146._0_4_ = fVar124 * fVar121;
      fVar210 = auVar60._4_4_;
      auVar146._4_4_ = fVar125 * fVar210;
      fVar221 = auVar60._8_4_;
      auVar146._8_4_ = fVar124 * fVar221;
      fVar222 = auVar60._12_4_;
      auVar146._12_4_ = fVar125 * fVar222;
      auVar156._0_4_ = fVar162 * fVar121;
      auVar156._4_4_ = fVar163 * fVar210;
      auVar156._8_4_ = fVar162 * fVar221;
      auVar156._12_4_ = fVar163 * fVar222;
      auVar166._0_4_ = fVar164 * fVar121;
      auVar166._4_4_ = fVar231 * fVar210;
      auVar166._8_4_ = fVar164 * fVar221;
      auVar166._12_4_ = fVar231 * fVar222;
      auVar129._0_4_ = fVar240 * fVar121;
      auVar129._4_4_ = fVar241 * fVar210;
      auVar129._8_4_ = fVar240 * fVar221;
      auVar129._12_4_ = fVar241 * fVar222;
      auVar60 = vfmadd231ps_fma(auVar146,auVar63,local_400);
      auVar65 = vfmadd231ps_fma(auVar156,auVar63,local_410);
      auVar64 = vfmadd231ps_avx512vl(auVar166,auVar63,auVar127);
      auVar63 = vfmadd231ps_fma(auVar129,auVar173,auVar63);
      auVar142._16_16_ = auVar60;
      auVar142._0_16_ = auVar60;
      auVar153._16_16_ = auVar65;
      auVar153._0_16_ = auVar65;
      auVar160._16_16_ = auVar64;
      auVar160._0_16_ = auVar64;
      uVar126 = auVar50._0_4_;
      auVar178._4_4_ = uVar126;
      auVar178._0_4_ = uVar126;
      auVar178._8_4_ = uVar126;
      auVar178._12_4_ = uVar126;
      uVar126 = auVar53._0_4_;
      auVar178._20_4_ = uVar126;
      auVar178._16_4_ = uVar126;
      auVar178._24_4_ = uVar126;
      auVar178._28_4_ = uVar126;
      auVar82 = vsubps_avx(auVar153,auVar142);
      auVar65 = vfmadd213ps_fma(auVar82,auVar178,auVar142);
      auVar82 = vsubps_avx(auVar160,auVar153);
      auVar72 = vfmadd213ps_fma(auVar82,auVar178,auVar153);
      auVar60 = vsubps_avx(auVar63,auVar64);
      auVar154._16_16_ = auVar60;
      auVar154._0_16_ = auVar60;
      auVar60 = vfmadd213ps_fma(auVar154,auVar178,auVar160);
      auVar82 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar65));
      auVar65 = vfmadd213ps_fma(auVar82,auVar178,ZEXT1632(auVar65));
      auVar82 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar72));
      auVar60 = vfmadd213ps_fma(auVar82,auVar178,ZEXT1632(auVar72));
      auVar82 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar65));
      auVar70 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar82,auVar178);
      auVar82 = vmulps_avx512vl(auVar82,auVar263._0_32_);
      auVar60 = auVar82._16_16_;
      fVar121 = auVar61._0_4_ * 0.33333334;
      auVar167._0_8_ =
           CONCAT44(auVar70._4_4_ + fVar121 * auVar82._4_4_,auVar70._0_4_ + fVar121 * auVar82._0_4_)
      ;
      auVar167._8_4_ = auVar70._8_4_ + fVar121 * auVar82._8_4_;
      auVar167._12_4_ = auVar70._12_4_ + fVar121 * auVar82._12_4_;
      auVar147._0_4_ = fVar121 * auVar82._16_4_;
      auVar147._4_4_ = fVar121 * auVar82._20_4_;
      auVar147._8_4_ = fVar121 * auVar82._24_4_;
      auVar147._12_4_ = fVar121 * auVar82._28_4_;
      auVar172 = vsubps_avx((undefined1  [16])0x0,auVar147);
      auVar75 = vshufpd_avx(auVar70,auVar70,3);
      auVar71 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar65 = vsubps_avx(auVar75,auVar70);
      auVar63 = vsubps_avx(auVar71,(undefined1  [16])0x0);
      auVar180._0_4_ = auVar63._0_4_ + auVar65._0_4_;
      auVar180._4_4_ = auVar63._4_4_ + auVar65._4_4_;
      auVar180._8_4_ = auVar63._8_4_ + auVar65._8_4_;
      auVar180._12_4_ = auVar63._12_4_ + auVar65._12_4_;
      auVar65 = vshufps_avx(auVar70,auVar70,0xb1);
      auVar63 = vshufps_avx(auVar167,auVar167,0xb1);
      auVar72 = vshufps_avx(auVar172,auVar172,0xb1);
      auVar64 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar233._4_4_ = auVar180._0_4_;
      auVar233._0_4_ = auVar180._0_4_;
      auVar233._8_4_ = auVar180._0_4_;
      auVar233._12_4_ = auVar180._0_4_;
      auVar73 = vshufps_avx(auVar180,auVar180,0x55);
      fVar121 = auVar73._0_4_;
      auVar194._0_4_ = auVar65._0_4_ * fVar121;
      fVar210 = auVar73._4_4_;
      auVar194._4_4_ = auVar65._4_4_ * fVar210;
      fVar221 = auVar73._8_4_;
      auVar194._8_4_ = auVar65._8_4_ * fVar221;
      fVar222 = auVar73._12_4_;
      auVar194._12_4_ = auVar65._12_4_ * fVar222;
      auVar205._0_4_ = auVar63._0_4_ * fVar121;
      auVar205._4_4_ = auVar63._4_4_ * fVar210;
      auVar205._8_4_ = auVar63._8_4_ * fVar221;
      auVar205._12_4_ = auVar63._12_4_ * fVar222;
      auVar213._0_4_ = auVar72._0_4_ * fVar121;
      auVar213._4_4_ = auVar72._4_4_ * fVar210;
      auVar213._8_4_ = auVar72._8_4_ * fVar221;
      auVar213._12_4_ = auVar72._12_4_ * fVar222;
      auVar181._0_4_ = auVar64._0_4_ * fVar121;
      auVar181._4_4_ = auVar64._4_4_ * fVar210;
      auVar181._8_4_ = auVar64._8_4_ * fVar221;
      auVar181._12_4_ = auVar64._12_4_ * fVar222;
      auVar65 = vfmadd231ps_fma(auVar194,auVar233,auVar70);
      auVar63 = vfmadd231ps_fma(auVar205,auVar233,auVar167);
      auVar73 = vfmadd231ps_fma(auVar213,auVar233,auVar172);
      auVar69 = vfmadd231ps_fma(auVar181,(undefined1  [16])0x0,auVar233);
      auVar74 = vshufpd_avx(auVar65,auVar65,1);
      auVar66 = vshufpd_avx(auVar63,auVar63,1);
      auVar67 = vshufpd_avx(auVar73,auVar73,1);
      auVar68 = vshufpd_avx(auVar69,auVar69,1);
      auVar72 = vminss_avx(auVar65,auVar63);
      auVar65 = vmaxss_avx(auVar63,auVar65);
      auVar64 = vminss_avx(auVar73,auVar69);
      auVar63 = vmaxss_avx(auVar69,auVar73);
      auVar64 = vminss_avx(auVar72,auVar64);
      auVar65 = vmaxss_avx(auVar63,auVar65);
      auVar73 = vminss_avx(auVar74,auVar66);
      auVar63 = vmaxss_avx(auVar66,auVar74);
      auVar74 = vminss_avx(auVar67,auVar68);
      auVar72 = vmaxss_avx(auVar68,auVar67);
      auVar73 = vminss_avx(auVar73,auVar74);
      auVar63 = vmaxss_avx(auVar72,auVar63);
      fVar221 = auVar64._0_4_;
      fVar210 = auVar63._0_4_;
      fVar121 = auVar65._0_4_;
      if ((0.0001 <= fVar221) || (fVar210 <= -0.0001)) {
        uVar18 = vcmpps_avx512vl(auVar73,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar19 = vcmpps_avx512vl(auVar64,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar121 & ((byte)uVar19 | (byte)uVar18)) != 0) goto LAB_01d30be4;
        uVar18 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar63,5);
        uVar19 = vcmpps_avx512vl(auVar73,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar19 | (ushort)uVar18) & 1) == 0) goto LAB_01d30be4;
        bVar10 = true;
        auVar259 = ZEXT1664(auVar257);
      }
      else {
LAB_01d30be4:
        auVar66 = auVar267._0_16_;
        uVar18 = vcmpss_avx512f(auVar64,auVar66,1);
        bVar10 = (bool)((byte)uVar18 & 1);
        iVar120 = auVar264._0_4_;
        fVar222 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar120);
        uVar18 = vcmpss_avx512f(auVar65,auVar66,1);
        bVar10 = (bool)((byte)uVar18 & 1);
        fVar223 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar120);
        bVar10 = fVar222 != fVar223;
        iVar266 = auVar267._0_4_;
        auVar103._16_16_ = auVar60;
        auVar103._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar102._4_28_ = auVar103._4_28_;
        auVar102._0_4_ = (uint)bVar10 * iVar266 + (uint)!bVar10 * 0x7f800000;
        auVar74 = auVar102._0_16_;
        auVar105._16_16_ = auVar60;
        auVar105._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar104._4_28_ = auVar105._4_28_;
        auVar104._0_4_ = (uint)bVar10 * iVar266 + (uint)!bVar10 * -0x800000;
        auVar72 = auVar104._0_16_;
        uVar18 = vcmpss_avx512f(auVar73,auVar66,1);
        bVar10 = (bool)((byte)uVar18 & 1);
        fVar143 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar120);
        if ((fVar222 != fVar143) || (NAN(fVar222) || NAN(fVar143))) {
          fVar222 = auVar73._0_4_;
          bVar10 = fVar222 == fVar221;
          if ((!bVar10) || (NAN(fVar222) || NAN(fVar221))) {
            auVar64 = vxorps_avx512vl(auVar64,auVar262._0_16_);
            auVar252._0_4_ = auVar64._0_4_ / (fVar222 - fVar221);
            auVar252._4_12_ = auVar64._4_12_;
            auVar64 = vsubss_avx512f(auVar62,auVar252);
            auVar73 = vfmadd213ss_avx512f(auVar64,auVar66,auVar252);
            auVar64 = auVar73;
          }
          else {
            vucomiss_avx512f(auVar66);
            auVar107._16_16_ = auVar60;
            auVar107._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar106._4_28_ = auVar107._4_28_;
            auVar106._0_4_ = (uint)bVar10 * iVar266 + (uint)!bVar10 * 0x7f800000;
            auVar73 = auVar106._0_16_;
            auVar64 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar74 = vminss_avx(auVar74,auVar73);
          auVar72 = vmaxss_avx(auVar64,auVar72);
        }
        uVar18 = vcmpss_avx512f(auVar63,auVar66,1);
        bVar10 = (bool)((byte)uVar18 & 1);
        fVar221 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar120);
        if ((fVar223 != fVar221) || (NAN(fVar223) || NAN(fVar221))) {
          bVar10 = fVar210 == fVar121;
          if ((!bVar10) || (NAN(fVar210) || NAN(fVar121))) {
            auVar65 = vxorps_avx512vl(auVar65,auVar262._0_16_);
            auVar214._0_4_ = auVar65._0_4_ / (fVar210 - fVar121);
            auVar214._4_12_ = auVar65._4_12_;
            auVar65 = vsubss_avx512f(auVar62,auVar214);
            auVar63 = vfmadd213ss_avx512f(auVar65,auVar66,auVar214);
            auVar65 = auVar63;
          }
          else {
            vucomiss_avx512f(auVar66);
            auVar109._16_16_ = auVar60;
            auVar109._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar108._4_28_ = auVar109._4_28_;
            auVar108._0_4_ = (uint)bVar10 * iVar266 + (uint)!bVar10 * 0x7f800000;
            auVar63 = auVar108._0_16_;
            auVar65 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar74 = vminss_avx(auVar74,auVar63);
          auVar72 = vmaxss_avx(auVar65,auVar72);
        }
        bVar10 = fVar143 != fVar221;
        auVar65 = vminss_avx512f(auVar74,auVar62);
        auVar111._16_16_ = auVar60;
        auVar111._0_16_ = auVar74;
        auVar110._4_28_ = auVar111._4_28_;
        auVar110._0_4_ = (uint)bVar10 * auVar65._0_4_ + (uint)!bVar10 * auVar74._0_4_;
        auVar65 = vmaxss_avx512f(auVar62,auVar72);
        auVar113._16_16_ = auVar60;
        auVar113._0_16_ = auVar72;
        auVar112._4_28_ = auVar113._4_28_;
        auVar112._0_4_ = (uint)bVar10 * auVar65._0_4_ + (uint)!bVar10 * auVar72._0_4_;
        auVar65 = vmaxss_avx512f(auVar66,auVar110._0_16_);
        auVar63 = vminss_avx512f(auVar112._0_16_,auVar62);
        bVar10 = true;
        if (auVar65._0_4_ <= auVar63._0_4_) {
          auVar66 = vmaxss_avx512f(auVar66,ZEXT416((uint)(auVar65._0_4_ + -0.1)));
          auVar67 = vminss_avx512f(ZEXT416((uint)(auVar63._0_4_ + 0.1)),auVar62);
          auVar130._0_8_ = auVar70._0_8_;
          auVar130._8_8_ = auVar130._0_8_;
          auVar206._8_8_ = auVar167._0_8_;
          auVar206._0_8_ = auVar167._0_8_;
          auVar215._8_8_ = auVar172._0_8_;
          auVar215._0_8_ = auVar172._0_8_;
          auVar65 = vshufpd_avx(auVar167,auVar167,3);
          auVar63 = vshufpd_avx(auVar172,auVar172,3);
          auVar72 = vshufps_avx(auVar66,auVar67,0);
          auVar68 = vsubps_avx512vl(auVar179,auVar72);
          fVar121 = auVar72._0_4_;
          auVar245._0_4_ = fVar121 * auVar75._0_4_;
          fVar210 = auVar72._4_4_;
          auVar245._4_4_ = fVar210 * auVar75._4_4_;
          fVar221 = auVar72._8_4_;
          auVar245._8_4_ = fVar221 * auVar75._8_4_;
          fVar222 = auVar72._12_4_;
          auVar245._12_4_ = fVar222 * auVar75._12_4_;
          auVar168._0_4_ = fVar121 * auVar65._0_4_;
          auVar168._4_4_ = fVar210 * auVar65._4_4_;
          auVar168._8_4_ = fVar221 * auVar65._8_4_;
          auVar168._12_4_ = fVar222 * auVar65._12_4_;
          auVar174._0_4_ = fVar121 * auVar63._0_4_;
          auVar174._4_4_ = fVar210 * auVar63._4_4_;
          auVar174._8_4_ = fVar221 * auVar63._8_4_;
          auVar174._12_4_ = fVar222 * auVar63._12_4_;
          auVar148._0_4_ = fVar121 * auVar71._0_4_;
          auVar148._4_4_ = fVar210 * auVar71._4_4_;
          auVar148._8_4_ = fVar221 * auVar71._8_4_;
          auVar148._12_4_ = fVar222 * auVar71._12_4_;
          auVar64 = vfmadd231ps_fma(auVar245,auVar68,auVar130);
          auVar73 = vfmadd231ps_fma(auVar168,auVar68,auVar206);
          auVar74 = vfmadd231ps_fma(auVar174,auVar68,auVar215);
          auVar75 = vfmadd231ps_fma(auVar148,auVar68,ZEXT816(0));
          auVar65 = vsubss_avx512f(auVar62,auVar66);
          auVar63 = vmovshdup_avx512vl(auVar257);
          auVar69 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar63._0_4_ * auVar66._0_4_)),auVar257,
                                        auVar65);
          auVar65 = vsubss_avx512f(auVar62,auVar67);
          auVar70 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar67._0_4_ * auVar63._0_4_)),auVar257,
                                        auVar65);
          auVar71 = vdivss_avx512f(auVar62,auVar61);
          auVar61 = vsubps_avx(auVar73,auVar64);
          auVar189 = auVar260._0_16_;
          auVar63 = vmulps_avx512vl(auVar61,auVar189);
          auVar61 = vsubps_avx(auVar74,auVar73);
          auVar72 = vmulps_avx512vl(auVar61,auVar189);
          auVar61 = vsubps_avx(auVar75,auVar74);
          auVar61 = vmulps_avx512vl(auVar61,auVar189);
          auVar65 = vminps_avx(auVar72,auVar61);
          auVar61 = vmaxps_avx(auVar72,auVar61);
          auVar65 = vminps_avx(auVar63,auVar65);
          auVar61 = vmaxps_avx(auVar63,auVar61);
          auVar63 = vshufpd_avx(auVar65,auVar65,3);
          auVar72 = vshufpd_avx(auVar61,auVar61,3);
          auVar65 = vminps_avx(auVar65,auVar63);
          auVar61 = vmaxps_avx(auVar61,auVar72);
          fVar121 = auVar71._0_4_;
          auVar195._0_4_ = fVar121 * auVar65._0_4_;
          auVar195._4_4_ = fVar121 * auVar65._4_4_;
          auVar195._8_4_ = fVar121 * auVar65._8_4_;
          auVar195._12_4_ = fVar121 * auVar65._12_4_;
          auVar182._0_4_ = fVar121 * auVar61._0_4_;
          auVar182._4_4_ = fVar121 * auVar61._4_4_;
          auVar182._8_4_ = fVar121 * auVar61._8_4_;
          auVar182._12_4_ = fVar121 * auVar61._12_4_;
          auVar71 = vdivss_avx512f(auVar62,ZEXT416((uint)(auVar70._0_4_ - auVar69._0_4_)));
          auVar61 = vshufpd_avx(auVar64,auVar64,3);
          auVar65 = vshufpd_avx(auVar73,auVar73,3);
          auVar63 = vshufpd_avx(auVar74,auVar74,3);
          auVar72 = vshufpd_avx(auVar75,auVar75,3);
          auVar61 = vsubps_avx(auVar61,auVar64);
          auVar64 = vsubps_avx(auVar65,auVar73);
          auVar73 = vsubps_avx(auVar63,auVar74);
          auVar72 = vsubps_avx(auVar72,auVar75);
          auVar65 = vminps_avx(auVar61,auVar64);
          auVar61 = vmaxps_avx(auVar61,auVar64);
          auVar63 = vminps_avx(auVar73,auVar72);
          auVar63 = vminps_avx(auVar65,auVar63);
          auVar65 = vmaxps_avx(auVar73,auVar72);
          auVar61 = vmaxps_avx(auVar61,auVar65);
          fVar121 = auVar71._0_4_;
          auVar216._0_4_ = fVar121 * auVar63._0_4_;
          auVar216._4_4_ = fVar121 * auVar63._4_4_;
          auVar216._8_4_ = fVar121 * auVar63._8_4_;
          auVar216._12_4_ = fVar121 * auVar63._12_4_;
          auVar226._0_4_ = fVar121 * auVar61._0_4_;
          auVar226._4_4_ = fVar121 * auVar61._4_4_;
          auVar226._8_4_ = fVar121 * auVar61._8_4_;
          auVar226._12_4_ = fVar121 * auVar61._12_4_;
          auVar172 = vinsertps_avx512f(auVar50,auVar69,0x10);
          auVar64 = vinsertps_avx(auVar53,auVar70,0x10);
          auVar123._0_4_ = auVar172._0_4_ + auVar64._0_4_;
          auVar123._4_4_ = auVar172._4_4_ + auVar64._4_4_;
          auVar123._8_4_ = auVar172._8_4_ + auVar64._8_4_;
          auVar123._12_4_ = auVar172._12_4_ + auVar64._12_4_;
          auVar20._8_4_ = 0x3f000000;
          auVar20._0_8_ = 0x3f0000003f000000;
          auVar20._12_4_ = 0x3f000000;
          auVar67 = vmulps_avx512vl(auVar123,auVar20);
          auVar63 = vshufps_avx(auVar67,auVar67,0x54);
          uVar126 = auVar67._0_4_;
          auVar138._4_4_ = uVar126;
          auVar138._0_4_ = uVar126;
          auVar138._8_4_ = uVar126;
          auVar138._12_4_ = uVar126;
          auVar65 = vfmadd213ps_fma(auVar49,auVar138,auVar59);
          auVar73 = vfmadd213ps_avx512vl(auVar57,auVar138,auVar58);
          auVar72 = vfmadd213ps_fma(auVar55,auVar138,auVar56);
          auVar61 = vsubps_avx(auVar73,auVar65);
          auVar65 = vfmadd213ps_fma(auVar61,auVar138,auVar65);
          auVar61 = vsubps_avx(auVar72,auVar73);
          auVar61 = vfmadd213ps_fma(auVar61,auVar138,auVar73);
          auVar61 = vsubps_avx(auVar61,auVar65);
          auVar65 = vfmadd231ps_fma(auVar65,auVar61,auVar138);
          auVar74 = vmulps_avx512vl(auVar61,auVar189);
          auVar234._8_8_ = auVar65._0_8_;
          auVar234._0_8_ = auVar65._0_8_;
          auVar61 = vshufpd_avx(auVar65,auVar65,3);
          auVar65 = vshufps_avx(auVar67,auVar67,0x55);
          auVar72 = vsubps_avx(auVar61,auVar234);
          auVar73 = vfmadd231ps_fma(auVar234,auVar65,auVar72);
          auVar253._8_8_ = auVar74._0_8_;
          auVar253._0_8_ = auVar74._0_8_;
          auVar61 = vshufpd_avx(auVar74,auVar74,3);
          auVar61 = vsubps_avx(auVar61,auVar253);
          auVar65 = vfmadd213ps_fma(auVar61,auVar65,auVar253);
          auVar139._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
          auVar139._8_4_ = auVar72._8_4_ ^ 0x80000000;
          auVar139._12_4_ = auVar72._12_4_ ^ 0x80000000;
          auVar61 = vmovshdup_avx(auVar65);
          auVar254._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
          auVar254._8_4_ = auVar61._8_4_ ^ 0x80000000;
          auVar254._12_4_ = auVar61._12_4_ ^ 0x80000000;
          auVar74 = vmovshdup_avx512vl(auVar72);
          auVar75 = vpermt2ps_avx512vl(auVar254,ZEXT416(5),auVar72);
          auVar61 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar61._0_4_ * auVar72._0_4_)),auVar65,
                                        auVar74);
          auVar65 = vpermt2ps_avx512vl(auVar65,SUB6416(ZEXT464(4),0),auVar139);
          auVar149._0_4_ = auVar61._0_4_;
          auVar149._4_4_ = auVar149._0_4_;
          auVar149._8_4_ = auVar149._0_4_;
          auVar149._12_4_ = auVar149._0_4_;
          auVar61 = vdivps_avx(auVar75,auVar149);
          auVar65 = vdivps_avx(auVar65,auVar149);
          fVar210 = auVar73._0_4_;
          auVar72 = vshufps_avx(auVar73,auVar73,0x55);
          fVar121 = auVar65._0_4_;
          auVar235._0_4_ = fVar210 * auVar61._0_4_ + auVar72._0_4_ * fVar121;
          auVar235._4_4_ = fVar210 * auVar61._4_4_ + auVar72._4_4_ * auVar65._4_4_;
          auVar235._8_4_ = fVar210 * auVar61._8_4_ + auVar72._8_4_ * auVar65._8_4_;
          auVar235._12_4_ = fVar210 * auVar61._12_4_ + auVar72._12_4_ * auVar65._12_4_;
          auVar68 = vsubps_avx(auVar63,auVar235);
          auVar73 = vmovshdup_avx(auVar61);
          auVar63 = vinsertps_avx(auVar195,auVar216,0x1c);
          auVar255._0_4_ = auVar73._0_4_ * auVar63._0_4_;
          auVar255._4_4_ = auVar73._4_4_ * auVar63._4_4_;
          auVar255._8_4_ = auVar73._8_4_ * auVar63._8_4_;
          auVar255._12_4_ = auVar73._12_4_ * auVar63._12_4_;
          auVar72 = vinsertps_avx(auVar182,auVar226,0x1c);
          auVar236._0_4_ = auVar73._0_4_ * auVar72._0_4_;
          auVar236._4_4_ = auVar73._4_4_ * auVar72._4_4_;
          auVar236._8_4_ = auVar73._8_4_ * auVar72._8_4_;
          auVar236._12_4_ = auVar73._12_4_ * auVar72._12_4_;
          auVar66 = vminps_avx512vl(auVar255,auVar236);
          auVar75 = vmaxps_avx(auVar236,auVar255);
          auVar71 = vmovshdup_avx(auVar65);
          auVar73 = vinsertps_avx(auVar216,auVar195,0x4c);
          auVar217._0_4_ = auVar71._0_4_ * auVar73._0_4_;
          auVar217._4_4_ = auVar71._4_4_ * auVar73._4_4_;
          auVar217._8_4_ = auVar71._8_4_ * auVar73._8_4_;
          auVar217._12_4_ = auVar71._12_4_ * auVar73._12_4_;
          auVar74 = vinsertps_avx(auVar226,auVar182,0x4c);
          auVar227._0_4_ = auVar71._0_4_ * auVar74._0_4_;
          auVar227._4_4_ = auVar71._4_4_ * auVar74._4_4_;
          auVar227._8_4_ = auVar71._8_4_ * auVar74._8_4_;
          auVar227._12_4_ = auVar71._12_4_ * auVar74._12_4_;
          auVar71 = vminps_avx(auVar217,auVar227);
          auVar66 = vaddps_avx512vl(auVar66,auVar71);
          auVar71 = vmaxps_avx(auVar227,auVar217);
          auVar218._0_4_ = auVar75._0_4_ + auVar71._0_4_;
          auVar218._4_4_ = auVar75._4_4_ + auVar71._4_4_;
          auVar218._8_4_ = auVar75._8_4_ + auVar71._8_4_;
          auVar218._12_4_ = auVar75._12_4_ + auVar71._12_4_;
          auVar228._8_8_ = 0x3f80000000000000;
          auVar228._0_8_ = 0x3f80000000000000;
          auVar75 = vsubps_avx(auVar228,auVar218);
          auVar71 = vsubps_avx(auVar228,auVar66);
          auVar66 = vsubps_avx(auVar172,auVar67);
          auVar67 = vsubps_avx(auVar64,auVar67);
          fVar143 = auVar66._0_4_;
          auVar256._0_4_ = fVar143 * auVar75._0_4_;
          fVar224 = auVar66._4_4_;
          auVar256._4_4_ = fVar224 * auVar75._4_4_;
          fVar242 = auVar66._8_4_;
          auVar256._8_4_ = fVar242 * auVar75._8_4_;
          fVar243 = auVar66._12_4_;
          auVar256._12_4_ = fVar243 * auVar75._12_4_;
          auVar76 = vbroadcastss_avx512vl(auVar61);
          auVar63 = vmulps_avx512vl(auVar76,auVar63);
          auVar72 = vmulps_avx512vl(auVar76,auVar72);
          auVar76 = vminps_avx512vl(auVar63,auVar72);
          auVar63 = vmaxps_avx(auVar72,auVar63);
          auVar196._0_4_ = fVar121 * auVar73._0_4_;
          auVar196._4_4_ = fVar121 * auVar73._4_4_;
          auVar196._8_4_ = fVar121 * auVar73._8_4_;
          auVar196._12_4_ = fVar121 * auVar73._12_4_;
          auVar183._0_4_ = fVar121 * auVar74._0_4_;
          auVar183._4_4_ = fVar121 * auVar74._4_4_;
          auVar183._8_4_ = fVar121 * auVar74._8_4_;
          auVar183._12_4_ = fVar121 * auVar74._12_4_;
          auVar72 = vminps_avx(auVar196,auVar183);
          auVar73 = vaddps_avx512vl(auVar76,auVar72);
          auVar74 = vmulps_avx512vl(auVar66,auVar71);
          fVar210 = auVar67._0_4_;
          auVar219._0_4_ = fVar210 * auVar75._0_4_;
          fVar221 = auVar67._4_4_;
          auVar219._4_4_ = fVar221 * auVar75._4_4_;
          fVar222 = auVar67._8_4_;
          auVar219._8_4_ = fVar222 * auVar75._8_4_;
          fVar223 = auVar67._12_4_;
          auVar219._12_4_ = fVar223 * auVar75._12_4_;
          auVar229._0_4_ = fVar210 * auVar71._0_4_;
          auVar229._4_4_ = fVar221 * auVar71._4_4_;
          auVar229._8_4_ = fVar222 * auVar71._8_4_;
          auVar229._12_4_ = fVar223 * auVar71._12_4_;
          auVar72 = vmaxps_avx(auVar183,auVar196);
          auVar184._0_4_ = auVar63._0_4_ + auVar72._0_4_;
          auVar184._4_4_ = auVar63._4_4_ + auVar72._4_4_;
          auVar184._8_4_ = auVar63._8_4_ + auVar72._8_4_;
          auVar184._12_4_ = auVar63._12_4_ + auVar72._12_4_;
          auVar197._8_8_ = 0x3f800000;
          auVar197._0_8_ = 0x3f800000;
          auVar63 = vsubps_avx(auVar197,auVar184);
          auVar72 = vsubps_avx(auVar197,auVar73);
          auVar246._0_4_ = fVar143 * auVar63._0_4_;
          auVar246._4_4_ = fVar224 * auVar63._4_4_;
          auVar246._8_4_ = fVar242 * auVar63._8_4_;
          auVar246._12_4_ = fVar243 * auVar63._12_4_;
          auVar237._0_4_ = fVar143 * auVar72._0_4_;
          auVar237._4_4_ = fVar224 * auVar72._4_4_;
          auVar237._8_4_ = fVar242 * auVar72._8_4_;
          auVar237._12_4_ = fVar243 * auVar72._12_4_;
          auVar185._0_4_ = fVar210 * auVar63._0_4_;
          auVar185._4_4_ = fVar221 * auVar63._4_4_;
          auVar185._8_4_ = fVar222 * auVar63._8_4_;
          auVar185._12_4_ = fVar223 * auVar63._12_4_;
          auVar198._0_4_ = fVar210 * auVar72._0_4_;
          auVar198._4_4_ = fVar221 * auVar72._4_4_;
          auVar198._8_4_ = fVar222 * auVar72._8_4_;
          auVar198._12_4_ = fVar223 * auVar72._12_4_;
          auVar63 = vminps_avx(auVar246,auVar237);
          auVar72 = vminps_avx(auVar185,auVar198);
          auVar73 = vminps_avx(auVar63,auVar72);
          auVar63 = vmaxps_avx(auVar237,auVar246);
          auVar72 = vmaxps_avx(auVar198,auVar185);
          auVar72 = vmaxps_avx(auVar72,auVar63);
          auVar75 = vminps_avx512vl(auVar256,auVar74);
          auVar63 = vminps_avx(auVar219,auVar229);
          auVar63 = vminps_avx(auVar75,auVar63);
          auVar63 = vhaddps_avx(auVar73,auVar63);
          auVar74 = vmaxps_avx512vl(auVar74,auVar256);
          auVar73 = vmaxps_avx(auVar229,auVar219);
          auVar73 = vmaxps_avx(auVar73,auVar74);
          auVar72 = vhaddps_avx(auVar72,auVar73);
          auVar63 = vshufps_avx(auVar63,auVar63,0xe8);
          auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
          auVar186._0_4_ = auVar63._0_4_ + auVar68._0_4_;
          auVar186._4_4_ = auVar63._4_4_ + auVar68._4_4_;
          auVar186._8_4_ = auVar63._8_4_ + auVar68._8_4_;
          auVar186._12_4_ = auVar63._12_4_ + auVar68._12_4_;
          auVar199._0_4_ = auVar72._0_4_ + auVar68._0_4_;
          auVar199._4_4_ = auVar72._4_4_ + auVar68._4_4_;
          auVar199._8_4_ = auVar72._8_4_ + auVar68._8_4_;
          auVar199._12_4_ = auVar72._12_4_ + auVar68._12_4_;
          auVar63 = vmaxps_avx(auVar172,auVar186);
          auVar72 = vminps_avx(auVar199,auVar64);
          uVar46 = vcmpps_avx512vl(auVar72,auVar63,1);
          local_440 = vinsertps_avx(auVar69,auVar70,0x10);
          auVar259 = ZEXT1664(local_440);
          auVar63 = ZEXT416(5);
          if ((uVar46 & 3) == 0) {
            vucomiss_avx512f(auVar50);
            auVar63 = vxorps_avx512vl(auVar63,auVar63);
            auVar267 = ZEXT1664(auVar63);
            if ((uint)uVar42 < 4 && (uVar5 == 0 || lVar45 == 0)) {
              bVar10 = false;
            }
            else {
              lVar45 = 200;
              do {
                auVar72 = vsubss_avx512f(auVar62,auVar68);
                fVar222 = auVar72._0_4_;
                fVar210 = fVar222 * fVar222 * fVar222;
                fVar223 = auVar68._0_4_;
                fVar221 = fVar223 * 3.0 * fVar222 * fVar222;
                fVar222 = fVar222 * fVar223 * fVar223 * 3.0;
                auVar169._4_4_ = fVar210;
                auVar169._0_4_ = fVar210;
                auVar169._8_4_ = fVar210;
                auVar169._12_4_ = fVar210;
                auVar157._4_4_ = fVar221;
                auVar157._0_4_ = fVar221;
                auVar157._8_4_ = fVar221;
                auVar157._12_4_ = fVar221;
                auVar131._4_4_ = fVar222;
                auVar131._0_4_ = fVar222;
                auVar131._8_4_ = fVar222;
                auVar131._12_4_ = fVar222;
                fVar223 = fVar223 * fVar223 * fVar223;
                auVar175._0_4_ = (float)local_420._0_4_ * fVar223;
                auVar175._4_4_ = (float)local_420._4_4_ * fVar223;
                auVar175._8_4_ = fStack_418 * fVar223;
                auVar175._12_4_ = fStack_414 * fVar223;
                auVar72 = vfmadd231ps_fma(auVar175,auVar56,auVar131);
                auVar72 = vfmadd231ps_fma(auVar72,auVar58,auVar157);
                auVar72 = vfmadd231ps_fma(auVar72,auVar59,auVar169);
                auVar132._8_8_ = auVar72._0_8_;
                auVar132._0_8_ = auVar72._0_8_;
                auVar72 = vshufpd_avx(auVar72,auVar72,3);
                auVar64 = vshufps_avx(auVar68,auVar68,0x55);
                auVar72 = vsubps_avx(auVar72,auVar132);
                auVar64 = vfmadd213ps_fma(auVar72,auVar64,auVar132);
                fVar210 = auVar64._0_4_;
                auVar72 = vshufps_avx(auVar64,auVar64,0x55);
                auVar133._0_4_ = auVar61._0_4_ * fVar210 + fVar121 * auVar72._0_4_;
                auVar133._4_4_ = auVar61._4_4_ * fVar210 + auVar65._4_4_ * auVar72._4_4_;
                auVar133._8_4_ = auVar61._8_4_ * fVar210 + auVar65._8_4_ * auVar72._8_4_;
                auVar133._12_4_ = auVar61._12_4_ * fVar210 + auVar65._12_4_ * auVar72._12_4_;
                auVar68 = vsubps_avx(auVar68,auVar133);
                auVar72 = vandps_avx512vl(auVar64,auVar261._0_16_);
                auVar64 = vprolq_avx512vl(auVar72,0x20);
                auVar72 = vmaxss_avx(auVar64,auVar72);
                bVar17 = auVar72._0_4_ <= (float)local_430._0_4_;
                if (auVar72._0_4_ < (float)local_430._0_4_) {
                  auVar61 = vucomiss_avx512f(auVar63);
                  if (bVar17) {
                    auVar62 = vucomiss_avx512f(auVar61);
                    auVar264 = ZEXT1664(auVar62);
                    if (bVar17) {
                      vmovshdup_avx(auVar61);
                      auVar62 = vucomiss_avx512f(auVar63);
                      if (bVar17) {
                        auVar65 = vucomiss_avx512f(auVar62);
                        auVar264 = ZEXT1664(auVar65);
                        if (bVar17) {
                          auVar72 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar67 = vinsertps_avx(auVar72,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar72 = vdpps_avx(auVar67,local_290,0x7f);
                          auVar64 = vdpps_avx(auVar67,local_2a0,0x7f);
                          auVar73 = vdpps_avx(auVar67,local_2b0,0x7f);
                          auVar74 = vdpps_avx(auVar67,local_2c0,0x7f);
                          auVar75 = vdpps_avx(auVar67,local_2d0,0x7f);
                          auVar71 = vdpps_avx(auVar67,local_2e0,0x7f);
                          auVar66 = vdpps_avx(auVar67,local_2f0,0x7f);
                          auVar67 = vdpps_avx(auVar67,local_300,0x7f);
                          auVar68 = vsubss_avx512f(auVar65,auVar62);
                          fVar222 = auVar62._0_4_;
                          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar75._0_4_)),auVar68
                                                    ,auVar72);
                          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * fVar222)),auVar68
                                                    ,auVar64);
                          auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar222)),auVar68
                                                    ,auVar73);
                          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar67._0_4_)),auVar68
                                                    ,auVar74);
                          auVar65 = vsubss_avx512f(auVar65,auVar61);
                          auVar187._0_4_ = auVar65._0_4_;
                          fVar121 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
                          local_120 = auVar61._0_4_;
                          fVar210 = local_120 * 3.0 * auVar187._0_4_ * auVar187._0_4_;
                          fVar221 = auVar187._0_4_ * local_120 * local_120 * 3.0;
                          fVar143 = local_120 * local_120 * local_120;
                          auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * auVar73._0_4_)),
                                                    ZEXT416((uint)fVar221),auVar64);
                          auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar210),auVar72);
                          auVar62 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar121),auVar62);
                          fVar223 = auVar62._0_4_;
                          if ((fVar144 <= fVar223) &&
                             (fVar224 = *(float *)(ray + k * 4 + 0x100), fVar223 <= fVar224)) {
                            auVar62 = vshufps_avx(auVar61,auVar61,0x55);
                            auVar64 = vsubps_avx512vl(auVar179,auVar62);
                            fVar242 = auVar62._0_4_;
                            auVar220._0_4_ = fVar242 * (float)local_320._0_4_;
                            fVar243 = auVar62._4_4_;
                            auVar220._4_4_ = fVar243 * (float)local_320._4_4_;
                            fVar249 = auVar62._8_4_;
                            auVar220._8_4_ = fVar249 * fStack_318;
                            fVar250 = auVar62._12_4_;
                            auVar220._12_4_ = fVar250 * fStack_314;
                            auVar230._0_4_ = fVar242 * (float)local_370._0_4_;
                            auVar230._4_4_ = fVar243 * (float)local_370._4_4_;
                            auVar230._8_4_ = fVar249 * fStack_368;
                            auVar230._12_4_ = fVar250 * fStack_364;
                            auVar238._0_4_ = fVar242 * (float)local_380._0_4_;
                            auVar238._4_4_ = fVar243 * (float)local_380._4_4_;
                            auVar238._8_4_ = fVar249 * fStack_378;
                            auVar238._12_4_ = fVar250 * fStack_374;
                            auVar200._0_4_ = fVar242 * (float)local_340._0_4_;
                            auVar200._4_4_ = fVar243 * (float)local_340._4_4_;
                            auVar200._8_4_ = fVar249 * fStack_338;
                            auVar200._12_4_ = fVar250 * fStack_334;
                            auVar62 = vfmadd231ps_fma(auVar220,auVar64,local_310);
                            auVar65 = vfmadd231ps_fma(auVar230,auVar64,local_350);
                            auVar72 = vfmadd231ps_fma(auVar238,auVar64,local_360);
                            auVar64 = vfmadd231ps_fma(auVar200,auVar64,local_330);
                            auVar62 = vsubps_avx(auVar65,auVar62);
                            auVar65 = vsubps_avx(auVar72,auVar65);
                            auVar72 = vsubps_avx(auVar64,auVar72);
                            auVar239._0_4_ = local_120 * auVar65._0_4_;
                            auVar239._4_4_ = local_120 * auVar65._4_4_;
                            auVar239._8_4_ = local_120 * auVar65._8_4_;
                            auVar239._12_4_ = local_120 * auVar65._12_4_;
                            auVar187._4_4_ = auVar187._0_4_;
                            auVar187._8_4_ = auVar187._0_4_;
                            auVar187._12_4_ = auVar187._0_4_;
                            auVar62 = vfmadd231ps_fma(auVar239,auVar187,auVar62);
                            auVar201._0_4_ = local_120 * auVar72._0_4_;
                            auVar201._4_4_ = local_120 * auVar72._4_4_;
                            auVar201._8_4_ = local_120 * auVar72._8_4_;
                            auVar201._12_4_ = local_120 * auVar72._12_4_;
                            auVar65 = vfmadd231ps_fma(auVar201,auVar187,auVar65);
                            auVar202._0_4_ = local_120 * auVar65._0_4_;
                            auVar202._4_4_ = local_120 * auVar65._4_4_;
                            auVar202._8_4_ = local_120 * auVar65._8_4_;
                            auVar202._12_4_ = local_120 * auVar65._12_4_;
                            auVar62 = vfmadd231ps_fma(auVar202,auVar187,auVar62);
                            auVar62 = vmulps_avx512vl(auVar62,auVar189);
                            pGVar6 = (context->scene->geometries).items[uVar47].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                              auVar176._0_4_ = fVar143 * (float)local_3c0._0_4_;
                              auVar176._4_4_ = fVar143 * (float)local_3c0._4_4_;
                              auVar176._8_4_ = fVar143 * fStack_3b8;
                              auVar176._12_4_ = fVar143 * fStack_3b4;
                              auVar170._4_4_ = fVar221;
                              auVar170._0_4_ = fVar221;
                              auVar170._8_4_ = fVar221;
                              auVar170._12_4_ = fVar221;
                              auVar65 = vfmadd132ps_fma(auVar170,auVar176,local_3b0);
                              auVar158._4_4_ = fVar210;
                              auVar158._0_4_ = fVar210;
                              auVar158._8_4_ = fVar210;
                              auVar158._12_4_ = fVar210;
                              auVar65 = vfmadd132ps_fma(auVar158,auVar65,local_3a0);
                              auVar150._4_4_ = fVar121;
                              auVar150._0_4_ = fVar121;
                              auVar150._8_4_ = fVar121;
                              auVar150._12_4_ = fVar121;
                              auVar64 = vfmadd132ps_fma(auVar150,auVar65,local_390);
                              auVar65 = vshufps_avx(auVar64,auVar64,0xc9);
                              auVar72 = vshufps_avx(auVar62,auVar62,0xc9);
                              auVar151._0_4_ = auVar64._0_4_ * auVar72._0_4_;
                              auVar151._4_4_ = auVar64._4_4_ * auVar72._4_4_;
                              auVar151._8_4_ = auVar64._8_4_ * auVar72._8_4_;
                              auVar151._12_4_ = auVar64._12_4_ * auVar72._12_4_;
                              auVar62 = vfmsub231ps_fma(auVar151,auVar62,auVar65);
                              local_140 = auVar62._0_4_;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x100) = fVar223;
                                uVar126 = vextractps_avx(auVar62,1);
                                *(undefined4 *)(ray + k * 4 + 0x180) = uVar126;
                                uVar126 = vextractps_avx(auVar62,2);
                                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar126;
                                *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                                *(float *)(ray + k * 4 + 0x1e0) = local_120;
                                *(float *)(ray + k * 4 + 0x200) = fVar222;
                                *(uint *)(ray + k * 4 + 0x220) = uVar4;
                                *(uint *)(ray + k * 4 + 0x240) = uVar47;
                                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                              }
                              else {
                                auVar161._8_4_ = 1;
                                auVar161._0_8_ = 0x100000001;
                                auVar161._12_4_ = 1;
                                auVar161._16_4_ = 1;
                                auVar161._20_4_ = 1;
                                auVar161._24_4_ = 1;
                                auVar161._28_4_ = 1;
                                local_100 = vpermps_avx2(auVar161,ZEXT1632(auVar61));
                                auVar82 = vpermps_avx2(auVar161,ZEXT1632(auVar62));
                                auVar171._8_4_ = 2;
                                auVar171._0_8_ = 0x200000002;
                                auVar171._12_4_ = 2;
                                auVar171._16_4_ = 2;
                                auVar171._20_4_ = 2;
                                auVar171._24_4_ = 2;
                                auVar171._28_4_ = 2;
                                local_160 = vpermps_avx2(auVar171,ZEXT1632(auVar62));
                                local_180[0] = (RTCHitN)auVar82[0];
                                local_180[1] = (RTCHitN)auVar82[1];
                                local_180[2] = (RTCHitN)auVar82[2];
                                local_180[3] = (RTCHitN)auVar82[3];
                                local_180[4] = (RTCHitN)auVar82[4];
                                local_180[5] = (RTCHitN)auVar82[5];
                                local_180[6] = (RTCHitN)auVar82[6];
                                local_180[7] = (RTCHitN)auVar82[7];
                                local_180[8] = (RTCHitN)auVar82[8];
                                local_180[9] = (RTCHitN)auVar82[9];
                                local_180[10] = (RTCHitN)auVar82[10];
                                local_180[0xb] = (RTCHitN)auVar82[0xb];
                                local_180[0xc] = (RTCHitN)auVar82[0xc];
                                local_180[0xd] = (RTCHitN)auVar82[0xd];
                                local_180[0xe] = (RTCHitN)auVar82[0xe];
                                local_180[0xf] = (RTCHitN)auVar82[0xf];
                                local_180[0x10] = (RTCHitN)auVar82[0x10];
                                local_180[0x11] = (RTCHitN)auVar82[0x11];
                                local_180[0x12] = (RTCHitN)auVar82[0x12];
                                local_180[0x13] = (RTCHitN)auVar82[0x13];
                                local_180[0x14] = (RTCHitN)auVar82[0x14];
                                local_180[0x15] = (RTCHitN)auVar82[0x15];
                                local_180[0x16] = (RTCHitN)auVar82[0x16];
                                local_180[0x17] = (RTCHitN)auVar82[0x17];
                                local_180[0x18] = (RTCHitN)auVar82[0x18];
                                local_180[0x19] = (RTCHitN)auVar82[0x19];
                                local_180[0x1a] = (RTCHitN)auVar82[0x1a];
                                local_180[0x1b] = (RTCHitN)auVar82[0x1b];
                                local_180[0x1c] = (RTCHitN)auVar82[0x1c];
                                local_180[0x1d] = (RTCHitN)auVar82[0x1d];
                                local_180[0x1e] = (RTCHitN)auVar82[0x1e];
                                local_180[0x1f] = (RTCHitN)auVar82[0x1f];
                                uStack_13c = local_140;
                                uStack_138 = local_140;
                                uStack_134 = local_140;
                                uStack_130 = local_140;
                                uStack_12c = local_140;
                                uStack_128 = local_140;
                                uStack_124 = local_140;
                                fStack_11c = local_120;
                                fStack_118 = local_120;
                                fStack_114 = local_120;
                                fStack_110 = local_120;
                                fStack_10c = local_120;
                                fStack_108 = local_120;
                                fStack_104 = local_120;
                                local_e0 = local_240._0_8_;
                                uStack_d8 = local_240._8_8_;
                                uStack_d0 = local_240._16_8_;
                                uStack_c8 = local_240._24_8_;
                                local_c0 = local_220;
                                vpcmpeqd_avx2(local_220,local_220);
                                uStack_9c = context->user->instID[0];
                                local_a0 = uStack_9c;
                                uStack_98 = uStack_9c;
                                uStack_94 = uStack_9c;
                                uStack_90 = uStack_9c;
                                uStack_8c = uStack_9c;
                                uStack_88 = uStack_9c;
                                uStack_84 = uStack_9c;
                                uStack_7c = context->user->instPrimID[0];
                                local_80 = uStack_7c;
                                uStack_78 = uStack_7c;
                                uStack_74 = uStack_7c;
                                uStack_70 = uStack_7c;
                                uStack_6c = uStack_7c;
                                uStack_68 = uStack_7c;
                                uStack_64 = uStack_7c;
                                *(float *)(ray + k * 4 + 0x100) = fVar223;
                                local_3e0 = local_260._0_8_;
                                uStack_3d8 = local_260._8_8_;
                                uStack_3d0 = local_260._16_8_;
                                uStack_3c8 = local_260._24_8_;
                                local_470.valid = (int *)&local_3e0;
                                local_470.geometryUserPtr = pGVar6->userPtr;
                                local_470.context = context->user;
                                local_470.hit = local_180;
                                local_470.N = 8;
                                local_470.ray = (RTCRayN *)ray;
                                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar6->intersectionFilterN)(&local_470);
                                  auVar259 = ZEXT1664(local_440);
                                  auVar60 = vxorps_avx512vl(auVar63,auVar63);
                                  auVar267 = ZEXT1664(auVar60);
                                  auVar264 = ZEXT464(0x3f800000);
                                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar263 = ZEXT3264(auVar82);
                                  auVar60 = auVar82._16_16_;
                                  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar262 = ZEXT1664(auVar61);
                                  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar261 = ZEXT1664(auVar61);
                                  auVar54 = vxorps_avx512vl(auVar54,auVar54);
                                  auVar268 = ZEXT1664(auVar54);
                                }
                                auVar61 = auVar268._0_16_;
                                auVar54 = auVar267._0_16_;
                                auVar38._8_8_ = uStack_3d8;
                                auVar38._0_8_ = local_3e0;
                                auVar38._16_8_ = uStack_3d0;
                                auVar38._24_8_ = uStack_3c8;
                                if (auVar38 == (undefined1  [32])0x0) {
LAB_01d31a49:
                                  *(float *)(ray + k * 4 + 0x100) = fVar224;
                                }
                                else {
                                  p_Var7 = context->args->filter;
                                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var7)(&local_470);
                                    auVar259 = ZEXT1664(local_440);
                                    auVar60 = vxorps_avx512vl(auVar54,auVar54);
                                    auVar267 = ZEXT1664(auVar60);
                                    auVar264 = ZEXT464(0x3f800000);
                                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar263 = ZEXT3264(auVar82);
                                    auVar60 = auVar82._16_16_;
                                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar262 = ZEXT1664(auVar54);
                                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar261 = ZEXT1664(auVar54);
                                    auVar54 = vxorps_avx512vl(auVar61,auVar61);
                                    auVar268 = ZEXT1664(auVar54);
                                  }
                                  auVar39._8_8_ = uStack_3d8;
                                  auVar39._0_8_ = local_3e0;
                                  auVar39._16_8_ = uStack_3d0;
                                  auVar39._24_8_ = uStack_3c8;
                                  if (auVar39 == (undefined1  [32])0x0) goto LAB_01d31a49;
                                  uVar46 = vptestmd_avx512vl(auVar39,auVar39);
                                  iVar120 = *(int *)(local_470.hit + 4);
                                  iVar266 = *(int *)(local_470.hit + 8);
                                  iVar33 = *(int *)(local_470.hit + 0xc);
                                  iVar34 = *(int *)(local_470.hit + 0x10);
                                  iVar35 = *(int *)(local_470.hit + 0x14);
                                  iVar36 = *(int *)(local_470.hit + 0x18);
                                  iVar37 = *(int *)(local_470.hit + 0x1c);
                                  bVar40 = (byte)uVar46;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar46 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar46 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar46 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                                  bVar16 = SUB81(uVar46 >> 7,0);
                                  *(uint *)(local_470.ray + 0x180) =
                                       (uint)(bVar40 & 1) * *(int *)local_470.hit |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x180);
                                  *(uint *)(local_470.ray + 0x184) =
                                       (uint)bVar17 * iVar120 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x184);
                                  *(uint *)(local_470.ray + 0x188) =
                                       (uint)bVar11 * iVar266 |
                                       (uint)!bVar11 * *(int *)(local_470.ray + 0x188);
                                  *(uint *)(local_470.ray + 0x18c) =
                                       (uint)bVar12 * iVar33 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x18c);
                                  *(uint *)(local_470.ray + 400) =
                                       (uint)bVar13 * iVar34 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 400);
                                  *(uint *)(local_470.ray + 0x194) =
                                       (uint)bVar14 * iVar35 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x194);
                                  *(uint *)(local_470.ray + 0x198) =
                                       (uint)bVar15 * iVar36 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x198);
                                  *(uint *)(local_470.ray + 0x19c) =
                                       (uint)bVar16 * iVar37 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x19c);
                                  iVar120 = *(int *)(local_470.hit + 0x24);
                                  iVar266 = *(int *)(local_470.hit + 0x28);
                                  iVar33 = *(int *)(local_470.hit + 0x2c);
                                  iVar34 = *(int *)(local_470.hit + 0x30);
                                  iVar35 = *(int *)(local_470.hit + 0x34);
                                  iVar36 = *(int *)(local_470.hit + 0x38);
                                  iVar37 = *(int *)(local_470.hit + 0x3c);
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar46 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar46 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar46 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                                  bVar16 = SUB81(uVar46 >> 7,0);
                                  *(uint *)(local_470.ray + 0x1a0) =
                                       (uint)(bVar40 & 1) * *(int *)(local_470.hit + 0x20) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x1a0);
                                  *(uint *)(local_470.ray + 0x1a4) =
                                       (uint)bVar17 * iVar120 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x1a4);
                                  *(uint *)(local_470.ray + 0x1a8) =
                                       (uint)bVar11 * iVar266 |
                                       (uint)!bVar11 * *(int *)(local_470.ray + 0x1a8);
                                  *(uint *)(local_470.ray + 0x1ac) =
                                       (uint)bVar12 * iVar33 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x1ac);
                                  *(uint *)(local_470.ray + 0x1b0) =
                                       (uint)bVar13 * iVar34 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x1b0);
                                  *(uint *)(local_470.ray + 0x1b4) =
                                       (uint)bVar14 * iVar35 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x1b4);
                                  *(uint *)(local_470.ray + 0x1b8) =
                                       (uint)bVar15 * iVar36 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x1b8);
                                  *(uint *)(local_470.ray + 0x1bc) =
                                       (uint)bVar16 * iVar37 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x1bc);
                                  iVar120 = *(int *)(local_470.hit + 0x44);
                                  iVar266 = *(int *)(local_470.hit + 0x48);
                                  iVar33 = *(int *)(local_470.hit + 0x4c);
                                  iVar34 = *(int *)(local_470.hit + 0x50);
                                  iVar35 = *(int *)(local_470.hit + 0x54);
                                  iVar36 = *(int *)(local_470.hit + 0x58);
                                  iVar37 = *(int *)(local_470.hit + 0x5c);
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar46 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar46 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar46 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                                  bVar16 = SUB81(uVar46 >> 7,0);
                                  *(uint *)(local_470.ray + 0x1c0) =
                                       (uint)(bVar40 & 1) * *(int *)(local_470.hit + 0x40) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x1c0);
                                  *(uint *)(local_470.ray + 0x1c4) =
                                       (uint)bVar17 * iVar120 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x1c4);
                                  *(uint *)(local_470.ray + 0x1c8) =
                                       (uint)bVar11 * iVar266 |
                                       (uint)!bVar11 * *(int *)(local_470.ray + 0x1c8);
                                  *(uint *)(local_470.ray + 0x1cc) =
                                       (uint)bVar12 * iVar33 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x1cc);
                                  *(uint *)(local_470.ray + 0x1d0) =
                                       (uint)bVar13 * iVar34 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x1d0);
                                  *(uint *)(local_470.ray + 0x1d4) =
                                       (uint)bVar14 * iVar35 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x1d4);
                                  *(uint *)(local_470.ray + 0x1d8) =
                                       (uint)bVar15 * iVar36 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x1d8);
                                  *(uint *)(local_470.ray + 0x1dc) =
                                       (uint)bVar16 * iVar37 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x1dc);
                                  iVar120 = *(int *)(local_470.hit + 100);
                                  iVar266 = *(int *)(local_470.hit + 0x68);
                                  iVar33 = *(int *)(local_470.hit + 0x6c);
                                  iVar34 = *(int *)(local_470.hit + 0x70);
                                  iVar35 = *(int *)(local_470.hit + 0x74);
                                  iVar36 = *(int *)(local_470.hit + 0x78);
                                  iVar37 = *(int *)(local_470.hit + 0x7c);
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar46 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar46 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar46 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                                  bVar16 = SUB81(uVar46 >> 7,0);
                                  *(uint *)(local_470.ray + 0x1e0) =
                                       (uint)(bVar40 & 1) * *(int *)(local_470.hit + 0x60) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x1e0);
                                  *(uint *)(local_470.ray + 0x1e4) =
                                       (uint)bVar17 * iVar120 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x1e4);
                                  *(uint *)(local_470.ray + 0x1e8) =
                                       (uint)bVar11 * iVar266 |
                                       (uint)!bVar11 * *(int *)(local_470.ray + 0x1e8);
                                  *(uint *)(local_470.ray + 0x1ec) =
                                       (uint)bVar12 * iVar33 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x1ec);
                                  *(uint *)(local_470.ray + 0x1f0) =
                                       (uint)bVar13 * iVar34 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x1f0);
                                  *(uint *)(local_470.ray + 500) =
                                       (uint)bVar14 * iVar35 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 500);
                                  *(uint *)(local_470.ray + 0x1f8) =
                                       (uint)bVar15 * iVar36 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x1f8);
                                  *(uint *)(local_470.ray + 0x1fc) =
                                       (uint)bVar16 * iVar37 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x1fc);
                                  iVar120 = *(int *)(local_470.ray + 0x204);
                                  iVar266 = *(int *)(local_470.ray + 0x208);
                                  iVar33 = *(int *)(local_470.ray + 0x20c);
                                  iVar34 = *(int *)(local_470.ray + 0x210);
                                  iVar35 = *(int *)(local_470.ray + 0x214);
                                  iVar36 = *(int *)(local_470.ray + 0x218);
                                  iVar37 = *(int *)(local_470.ray + 0x21c);
                                  auVar114._0_4_ =
                                       (uint)(bVar40 & 1) * *(int *)(local_470.hit + 0x80) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x200);
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  auVar114._4_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x84) |
                                       (uint)!bVar17 * iVar120;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar114._8_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x88) |
                                       (uint)!bVar17 * iVar266;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar114._12_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x8c) |
                                       (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar114._16_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x90) |
                                       (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar114._20_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x94) |
                                       (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar114._24_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x98) |
                                       (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar114._28_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x9c) |
                                       (uint)!bVar17 * iVar37;
                                  *(undefined1 (*) [32])(local_470.ray + 0x200) = auVar114;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  uVar119 = bVar17 * auVar114._4_4_ | (uint)!bVar17 * iVar120;
                                  auVar29._4_24_ = auVar114._8_24_;
                                  auVar29._0_4_ = uVar119;
                                  auVar115._0_8_ = auVar29._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar115._8_4_ = bVar17 * auVar114._8_4_ | (uint)!bVar17 * iVar266
                                  ;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar115._12_4_ =
                                       bVar17 * auVar114._12_4_ | (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar115._16_4_ =
                                       bVar17 * auVar114._16_4_ | (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar115._20_4_ =
                                       bVar17 * auVar114._20_4_ | (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar115._24_4_ =
                                       bVar17 * auVar114._24_4_ | (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar115._28_4_ =
                                       bVar17 * auVar114._28_4_ | (uint)!bVar17 * iVar37;
                                  auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0xa0));
                                  *(undefined1 (*) [32])(local_470.ray + 0x220) = auVar82;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  uVar119 = bVar17 * uVar119 | (uint)!bVar17 * iVar120;
                                  auVar30._4_24_ = auVar115._8_24_;
                                  auVar30._0_4_ = uVar119;
                                  auVar116._0_8_ = auVar30._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar116._8_4_ = bVar17 * auVar115._8_4_ | (uint)!bVar17 * iVar266
                                  ;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar116._12_4_ =
                                       bVar17 * auVar115._12_4_ | (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar116._16_4_ =
                                       bVar17 * auVar115._16_4_ | (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar116._20_4_ =
                                       bVar17 * auVar115._20_4_ | (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar116._24_4_ =
                                       bVar17 * auVar115._24_4_ | (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar116._28_4_ =
                                       bVar17 * auVar115._28_4_ | (uint)!bVar17 * iVar37;
                                  auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0xc0));
                                  *(undefined1 (*) [32])(local_470.ray + 0x240) = auVar82;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  uVar119 = bVar17 * uVar119 | (uint)!bVar17 * iVar120;
                                  auVar31._4_24_ = auVar116._8_24_;
                                  auVar31._0_4_ = uVar119;
                                  auVar117._0_8_ = auVar31._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar117._8_4_ = bVar17 * auVar116._8_4_ | (uint)!bVar17 * iVar266
                                  ;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar117._12_4_ =
                                       bVar17 * auVar116._12_4_ | (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar117._16_4_ =
                                       bVar17 * auVar116._16_4_ | (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar117._20_4_ =
                                       bVar17 * auVar116._20_4_ | (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar117._24_4_ =
                                       bVar17 * auVar116._24_4_ | (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar117._28_4_ =
                                       bVar17 * auVar116._28_4_ | (uint)!bVar17 * iVar37;
                                  auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0xe0));
                                  *(undefined1 (*) [32])(local_470.ray + 0x260) = auVar82;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  auVar32._4_24_ = auVar117._8_24_;
                                  auVar32._0_4_ = bVar17 * uVar119 | (uint)!bVar17 * iVar120;
                                  auVar118._0_8_ = auVar32._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar118._8_4_ = bVar17 * auVar117._8_4_ | (uint)!bVar17 * iVar266
                                  ;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar118._12_4_ =
                                       bVar17 * auVar117._12_4_ | (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar118._16_4_ =
                                       bVar17 * auVar117._16_4_ | (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar118._20_4_ =
                                       bVar17 * auVar117._20_4_ | (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar118._24_4_ =
                                       bVar17 * auVar117._24_4_ | (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar118._28_4_ =
                                       bVar17 * auVar117._28_4_ | (uint)!bVar17 * iVar37;
                                  auVar60 = auVar118._16_16_;
                                  auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0x100));
                                  *(undefined1 (*) [32])(local_470.ray + 0x280) = auVar82;
                                }
                                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar260 = ZEXT1664(auVar54);
                                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar265 = ZEXT1664(auVar54);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar45 = lVar45 + -1;
              } while (lVar45 != 0);
            }
          }
          else {
            auVar54 = vxorps_avx512vl(ZEXT416(5),auVar63);
            auVar267 = ZEXT1664(auVar54);
          }
        }
        else {
          auVar259 = ZEXT1664(auVar257);
        }
      }
    } while (bVar10);
    auVar60 = vinsertps_avx512f(auVar50,auVar53,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }